

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Primitive PVar13;
  int iVar14;
  Geometry *pGVar15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  long lVar29;
  long lVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined8 uVar71;
  undefined8 uVar72;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  byte bVar75;
  ulong uVar76;
  ulong uVar77;
  bool bVar78;
  Geometry *geometry;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  long lVar79;
  uint uVar80;
  ulong uVar81;
  byte bVar82;
  float fVar83;
  float fVar84;
  float fVar130;
  float fVar131;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar85 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar88 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar89 [16];
  float fVar132;
  float fVar134;
  float fVar135;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar133;
  float fVar136;
  float fVar137;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar138;
  undefined4 uVar139;
  float fVar141;
  float fVar142;
  undefined1 auVar140 [16];
  undefined8 uVar143;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  float fVar149;
  float fVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar169;
  float fVar171;
  undefined1 auVar170 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  uint uVar178;
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [16];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  float old_t_1;
  RTCFilterFunctionNArguments local_690;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  LinearSpace3fa *local_588;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  uint local_480;
  uint uStack_47c;
  uint uStack_478;
  uint uStack_474;
  uint uStack_470;
  uint uStack_46c;
  uint uStack_468;
  uint uStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 local_420;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined4 local_380;
  int local_37c;
  undefined1 local_370 [16];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  float local_320 [4];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  
  PVar13 = prim[1];
  uVar77 = (ulong)(byte)PVar13;
  fVar150 = *(float *)(prim + uVar77 * 0x19 + 0x12);
  auVar25 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar25 = vinsertps_avx(auVar25,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar87 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar85 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar147 = vsubps_avx(auVar25,*(undefined1 (*) [16])(prim + uVar77 * 0x19 + 6));
  fVar149 = fVar150 * auVar147._0_4_;
  fVar138 = fVar150 * auVar85._0_4_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar77 * 4 + 6);
  auVar96 = vpmovsxbd_avx2(auVar25);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar77 * 5 + 6);
  auVar93 = vpmovsxbd_avx2(auVar87);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar77 * 6 + 6);
  auVar94 = vpmovsxbd_avx2(auVar86);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar77 * 0xb + 6);
  auVar95 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar13 * 0xc) + 6);
  auVar99 = vpmovsxbd_avx2(auVar9);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar107 = vcvtdq2ps_avx(auVar99);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (uint)(byte)PVar13 * 0xc + uVar77 + 6);
  auVar97 = vpmovsxbd_avx2(auVar10);
  auVar97 = vcvtdq2ps_avx(auVar97);
  uVar81 = (ulong)(uint)((int)(uVar77 * 9) * 2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar81 + 6);
  auVar98 = vpmovsxbd_avx2(auVar11);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *(ulong *)(prim + uVar81 + uVar77 + 6);
  auVar106 = vpmovsxbd_avx2(auVar195);
  auVar106 = vcvtdq2ps_avx(auVar106);
  uVar76 = (ulong)(uint)((int)(uVar77 * 5) << 2);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar76 + 6);
  auVar92 = vpmovsxbd_avx2(auVar12);
  auVar108 = vcvtdq2ps_avx(auVar92);
  auVar181._4_4_ = fVar138;
  auVar181._0_4_ = fVar138;
  auVar181._8_4_ = fVar138;
  auVar181._12_4_ = fVar138;
  auVar181._16_4_ = fVar138;
  auVar181._20_4_ = fVar138;
  auVar181._24_4_ = fVar138;
  auVar181._28_4_ = fVar138;
  auVar187._8_4_ = 1;
  auVar187._0_8_ = 0x100000001;
  auVar187._12_4_ = 1;
  auVar187._16_4_ = 1;
  auVar187._20_4_ = 1;
  auVar187._24_4_ = 1;
  auVar187._28_4_ = 1;
  auVar90 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar101 = ZEXT1632(CONCAT412(fVar150 * auVar85._12_4_,
                                CONCAT48(fVar150 * auVar85._8_4_,
                                         CONCAT44(fVar150 * auVar85._4_4_,fVar138))));
  auVar100 = vpermps_avx2(auVar187,auVar101);
  auVar91 = vpermps_avx512vl(auVar90,auVar101);
  fVar138 = auVar91._0_4_;
  fVar141 = auVar91._4_4_;
  auVar101._4_4_ = fVar141 * auVar94._4_4_;
  auVar101._0_4_ = fVar138 * auVar94._0_4_;
  fVar142 = auVar91._8_4_;
  auVar101._8_4_ = fVar142 * auVar94._8_4_;
  fVar169 = auVar91._12_4_;
  auVar101._12_4_ = fVar169 * auVar94._12_4_;
  fVar171 = auVar91._16_4_;
  auVar101._16_4_ = fVar171 * auVar94._16_4_;
  fVar83 = auVar91._20_4_;
  auVar101._20_4_ = fVar83 * auVar94._20_4_;
  fVar84 = auVar91._24_4_;
  auVar101._24_4_ = fVar84 * auVar94._24_4_;
  auVar101._28_4_ = auVar99._28_4_;
  auVar99._4_4_ = auVar97._4_4_ * fVar141;
  auVar99._0_4_ = auVar97._0_4_ * fVar138;
  auVar99._8_4_ = auVar97._8_4_ * fVar142;
  auVar99._12_4_ = auVar97._12_4_ * fVar169;
  auVar99._16_4_ = auVar97._16_4_ * fVar171;
  auVar99._20_4_ = auVar97._20_4_ * fVar83;
  auVar99._24_4_ = auVar97._24_4_ * fVar84;
  auVar99._28_4_ = auVar92._28_4_;
  auVar92._4_4_ = auVar108._4_4_ * fVar141;
  auVar92._0_4_ = auVar108._0_4_ * fVar138;
  auVar92._8_4_ = auVar108._8_4_ * fVar142;
  auVar92._12_4_ = auVar108._12_4_ * fVar169;
  auVar92._16_4_ = auVar108._16_4_ * fVar171;
  auVar92._20_4_ = auVar108._20_4_ * fVar83;
  auVar92._24_4_ = auVar108._24_4_ * fVar84;
  auVar92._28_4_ = auVar91._28_4_;
  auVar25 = vfmadd231ps_fma(auVar101,auVar100,auVar93);
  auVar87 = vfmadd231ps_fma(auVar99,auVar100,auVar107);
  auVar86 = vfmadd231ps_fma(auVar92,auVar106,auVar100);
  auVar25 = vfmadd231ps_fma(ZEXT1632(auVar25),auVar181,auVar96);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar181,auVar95);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar98,auVar181);
  auVar182._4_4_ = fVar149;
  auVar182._0_4_ = fVar149;
  auVar182._8_4_ = fVar149;
  auVar182._12_4_ = fVar149;
  auVar182._16_4_ = fVar149;
  auVar182._20_4_ = fVar149;
  auVar182._24_4_ = fVar149;
  auVar182._28_4_ = fVar149;
  auVar92 = ZEXT1632(CONCAT412(fVar150 * auVar147._12_4_,
                               CONCAT48(fVar150 * auVar147._8_4_,
                                        CONCAT44(fVar150 * auVar147._4_4_,fVar149))));
  auVar99 = vpermps_avx2(auVar187,auVar92);
  auVar92 = vpermps_avx512vl(auVar90,auVar92);
  fVar150 = auVar92._0_4_;
  fVar138 = auVar92._4_4_;
  auVar100._4_4_ = fVar138 * auVar94._4_4_;
  auVar100._0_4_ = fVar150 * auVar94._0_4_;
  fVar141 = auVar92._8_4_;
  auVar100._8_4_ = fVar141 * auVar94._8_4_;
  fVar142 = auVar92._12_4_;
  auVar100._12_4_ = fVar142 * auVar94._12_4_;
  fVar169 = auVar92._16_4_;
  auVar100._16_4_ = fVar169 * auVar94._16_4_;
  fVar171 = auVar92._20_4_;
  auVar100._20_4_ = fVar171 * auVar94._20_4_;
  fVar83 = auVar92._24_4_;
  auVar100._24_4_ = fVar83 * auVar94._24_4_;
  auVar100._28_4_ = 1;
  auVar90._4_4_ = auVar97._4_4_ * fVar138;
  auVar90._0_4_ = auVar97._0_4_ * fVar150;
  auVar90._8_4_ = auVar97._8_4_ * fVar141;
  auVar90._12_4_ = auVar97._12_4_ * fVar142;
  auVar90._16_4_ = auVar97._16_4_ * fVar169;
  auVar90._20_4_ = auVar97._20_4_ * fVar171;
  auVar90._24_4_ = auVar97._24_4_ * fVar83;
  auVar90._28_4_ = auVar94._28_4_;
  auVar97._4_4_ = auVar108._4_4_ * fVar138;
  auVar97._0_4_ = auVar108._0_4_ * fVar150;
  auVar97._8_4_ = auVar108._8_4_ * fVar141;
  auVar97._12_4_ = auVar108._12_4_ * fVar142;
  auVar97._16_4_ = auVar108._16_4_ * fVar169;
  auVar97._20_4_ = auVar108._20_4_ * fVar171;
  auVar97._24_4_ = auVar108._24_4_ * fVar83;
  auVar97._28_4_ = auVar92._28_4_;
  auVar8 = vfmadd231ps_fma(auVar100,auVar99,auVar93);
  auVar9 = vfmadd231ps_fma(auVar90,auVar99,auVar107);
  auVar10 = vfmadd231ps_fma(auVar97,auVar99,auVar106);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar182,auVar96);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar182,auVar95);
  auVar173._8_4_ = 0x7fffffff;
  auVar173._0_8_ = 0x7fffffff7fffffff;
  auVar173._12_4_ = 0x7fffffff;
  auVar173._16_4_ = 0x7fffffff;
  auVar173._20_4_ = 0x7fffffff;
  auVar173._24_4_ = 0x7fffffff;
  auVar173._28_4_ = 0x7fffffff;
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar182,auVar98);
  auVar96 = vandps_avx(ZEXT1632(auVar25),auVar173);
  auVar170._8_4_ = 0x219392ef;
  auVar170._0_8_ = 0x219392ef219392ef;
  auVar170._12_4_ = 0x219392ef;
  auVar170._16_4_ = 0x219392ef;
  auVar170._20_4_ = 0x219392ef;
  auVar170._24_4_ = 0x219392ef;
  auVar170._28_4_ = 0x219392ef;
  uVar81 = vcmpps_avx512vl(auVar96,auVar170,1);
  bVar78 = (bool)((byte)uVar81 & 1);
  auVar91._0_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar25._0_4_;
  bVar78 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar25._4_4_;
  bVar78 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar25._8_4_;
  bVar78 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar25._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar81 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar87),auVar173);
  uVar81 = vcmpps_avx512vl(auVar96,auVar170,1);
  bVar78 = (bool)((byte)uVar81 & 1);
  auVar102._0_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar87._0_4_;
  bVar78 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar102._4_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar87._4_4_;
  bVar78 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar102._8_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar87._8_4_;
  bVar78 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar102._12_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar87._12_4_;
  auVar102._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * 0x219392ef;
  auVar102._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * 0x219392ef;
  auVar102._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * 0x219392ef;
  auVar102._28_4_ = (uint)(byte)(uVar81 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar86),auVar173);
  uVar81 = vcmpps_avx512vl(auVar96,auVar170,1);
  bVar78 = (bool)((byte)uVar81 & 1);
  auVar96._0_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar86._0_4_;
  bVar78 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar86._4_4_;
  bVar78 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar86._8_4_;
  bVar78 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar86._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar81 >> 7) * 0x219392ef;
  auVar93 = vrcp14ps_avx512vl(auVar91);
  auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar95 = vfnmadd213ps_avx512vl(auVar91,auVar93,auVar94);
  auVar25 = vfmadd132ps_fma(auVar95,auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar102);
  auVar95 = vfnmadd213ps_avx512vl(auVar102,auVar93,auVar94);
  auVar87 = vfmadd132ps_fma(auVar95,auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar96);
  auVar96 = vfnmadd213ps_avx512vl(auVar96,auVar93,auVar94);
  auVar86 = vfmadd132ps_fma(auVar96,auVar93,auVar93);
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 7 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar8));
  auVar98._4_4_ = auVar25._4_4_ * auVar96._4_4_;
  auVar98._0_4_ = auVar25._0_4_ * auVar96._0_4_;
  auVar98._8_4_ = auVar25._8_4_ * auVar96._8_4_;
  auVar98._12_4_ = auVar25._12_4_ * auVar96._12_4_;
  auVar98._16_4_ = auVar96._16_4_ * 0.0;
  auVar98._20_4_ = auVar96._20_4_ * 0.0;
  auVar98._24_4_ = auVar96._24_4_ * 0.0;
  auVar98._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 9 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar8));
  auVar97 = vpbroadcastd_avx512vl();
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar13 * 0x10 + 6));
  auVar105._0_4_ = auVar25._0_4_ * auVar96._0_4_;
  auVar105._4_4_ = auVar25._4_4_ * auVar96._4_4_;
  auVar105._8_4_ = auVar25._8_4_ * auVar96._8_4_;
  auVar105._12_4_ = auVar25._12_4_ * auVar96._12_4_;
  auVar105._16_4_ = auVar96._16_4_ * 0.0;
  auVar105._20_4_ = auVar96._20_4_ * 0.0;
  auVar105._24_4_ = auVar96._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar13 * 0x10 + uVar77 * -2 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar9));
  auVar106._4_4_ = auVar87._4_4_ * auVar96._4_4_;
  auVar106._0_4_ = auVar87._0_4_ * auVar96._0_4_;
  auVar106._8_4_ = auVar87._8_4_ * auVar96._8_4_;
  auVar106._12_4_ = auVar87._12_4_ * auVar96._12_4_;
  auVar106._16_4_ = auVar96._16_4_ * 0.0;
  auVar106._20_4_ = auVar96._20_4_ * 0.0;
  auVar106._24_4_ = auVar96._24_4_ * 0.0;
  auVar106._28_4_ = auVar96._28_4_;
  auVar96 = vcvtdq2ps_avx(auVar93);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar9));
  auVar104._0_4_ = auVar87._0_4_ * auVar96._0_4_;
  auVar104._4_4_ = auVar87._4_4_ * auVar96._4_4_;
  auVar104._8_4_ = auVar87._8_4_ * auVar96._8_4_;
  auVar104._12_4_ = auVar87._12_4_ * auVar96._12_4_;
  auVar104._16_4_ = auVar96._16_4_ * 0.0;
  auVar104._20_4_ = auVar96._20_4_ * 0.0;
  auVar104._24_4_ = auVar96._24_4_ * 0.0;
  auVar104._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 + uVar77 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar10));
  auVar108._4_4_ = auVar96._4_4_ * auVar86._4_4_;
  auVar108._0_4_ = auVar96._0_4_ * auVar86._0_4_;
  auVar108._8_4_ = auVar96._8_4_ * auVar86._8_4_;
  auVar108._12_4_ = auVar96._12_4_ * auVar86._12_4_;
  auVar108._16_4_ = auVar96._16_4_ * 0.0;
  auVar108._20_4_ = auVar96._20_4_ * 0.0;
  auVar108._24_4_ = auVar96._24_4_ * 0.0;
  auVar108._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 0x17 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar10));
  auVar103._0_4_ = auVar86._0_4_ * auVar96._0_4_;
  auVar103._4_4_ = auVar86._4_4_ * auVar96._4_4_;
  auVar103._8_4_ = auVar86._8_4_ * auVar96._8_4_;
  auVar103._12_4_ = auVar86._12_4_ * auVar96._12_4_;
  auVar103._16_4_ = auVar96._16_4_ * 0.0;
  auVar103._20_4_ = auVar96._20_4_ * 0.0;
  auVar103._24_4_ = auVar96._24_4_ * 0.0;
  auVar103._28_4_ = 0;
  auVar96 = vpminsd_avx2(auVar98,auVar105);
  auVar93 = vpminsd_avx2(auVar106,auVar104);
  auVar96 = vmaxps_avx(auVar96,auVar93);
  auVar93 = vpminsd_avx2(auVar108,auVar103);
  uVar139 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar94._4_4_ = uVar139;
  auVar94._0_4_ = uVar139;
  auVar94._8_4_ = uVar139;
  auVar94._12_4_ = uVar139;
  auVar94._16_4_ = uVar139;
  auVar94._20_4_ = uVar139;
  auVar94._24_4_ = uVar139;
  auVar94._28_4_ = uVar139;
  auVar93 = vmaxps_avx512vl(auVar93,auVar94);
  auVar96 = vmaxps_avx(auVar96,auVar93);
  auVar93._8_4_ = 0x3f7ffffa;
  auVar93._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar93._12_4_ = 0x3f7ffffa;
  auVar93._16_4_ = 0x3f7ffffa;
  auVar93._20_4_ = 0x3f7ffffa;
  auVar93._24_4_ = 0x3f7ffffa;
  auVar93._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar96,auVar93);
  auVar96 = vpmaxsd_avx2(auVar98,auVar105);
  auVar93 = vpmaxsd_avx2(auVar106,auVar104);
  auVar96 = vminps_avx(auVar96,auVar93);
  auVar93 = vpmaxsd_avx2(auVar108,auVar103);
  uVar139 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar95._4_4_ = uVar139;
  auVar95._0_4_ = uVar139;
  auVar95._8_4_ = uVar139;
  auVar95._12_4_ = uVar139;
  auVar95._16_4_ = uVar139;
  auVar95._20_4_ = uVar139;
  auVar95._24_4_ = uVar139;
  auVar95._28_4_ = uVar139;
  auVar93 = vminps_avx512vl(auVar93,auVar95);
  auVar96 = vminps_avx(auVar96,auVar93);
  auVar107._8_4_ = 0x3f800003;
  auVar107._0_8_ = 0x3f8000033f800003;
  auVar107._12_4_ = 0x3f800003;
  auVar107._16_4_ = 0x3f800003;
  auVar107._20_4_ = 0x3f800003;
  auVar107._24_4_ = 0x3f800003;
  auVar107._28_4_ = 0x3f800003;
  auVar96 = vmulps_avx512vl(auVar96,auVar107);
  uVar28 = vpcmpgtd_avx512vl(auVar97,_DAT_01fe9900);
  uVar26 = vcmpps_avx512vl(local_80,auVar96,2);
  if ((byte)((byte)uVar26 & (byte)uVar28) == 0) {
    bVar78 = false;
  }
  else {
    uVar81 = (ulong)(byte)((byte)uVar26 & (byte)uVar28);
    local_588 = pre->ray_space + k;
    local_2a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      auVar96 = local_460;
      lVar29 = 0;
      for (uVar76 = uVar81; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
        lVar29 = lVar29 + 1;
      }
      uVar80 = *(uint *)(prim + 2);
      pGVar15 = (context->scene->geometries).items[uVar80].ptr;
      local_440._0_8_ = CONCAT44(0,*(uint *)(prim + lVar29 * 4 + 6));
      uVar76 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                               pGVar15[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i *
                               CONCAT44(0,*(uint *)(prim + lVar29 * 4 + 6)));
      p_Var16 = pGVar15[1].intersectionFilterN;
      lVar29 = *(long *)&pGVar15[1].time_range.upper;
      auVar25 = *(undefined1 (*) [16])(lVar29 + (long)p_Var16 * uVar76);
      pauVar3 = (undefined1 (*) [16])(lVar29 + (uVar76 + 1) * (long)p_Var16);
      uVar26 = *(undefined8 *)*pauVar3;
      uVar28 = *(undefined8 *)(*pauVar3 + 8);
      auVar11 = *pauVar3;
      auVar9 = *pauVar3;
      auVar87 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar29 + (uVar76 + 2) * (long)p_Var16);
      uVar71 = *(undefined8 *)*pauVar4;
      uVar72 = *(undefined8 *)(*pauVar4 + 8);
      auVar10 = *pauVar4;
      auVar8 = *pauVar4;
      auVar86 = *pauVar4;
      uVar81 = uVar81 - 1 & uVar81;
      pauVar5 = (undefined1 (*) [12])(lVar29 + (uVar76 + 3) * (long)p_Var16);
      local_5a0 = (float)*(undefined8 *)*pauVar5;
      fStack_59c = (float)((ulong)*(undefined8 *)*pauVar5 >> 0x20);
      fStack_598 = (float)*(undefined8 *)(*pauVar5 + 8);
      fStack_594 = (float)((ulong)*(undefined8 *)(*pauVar5 + 8) >> 0x20);
      if (uVar81 != 0) {
        uVar77 = uVar81 - 1 & uVar81;
        for (uVar76 = uVar81; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
        }
        if (uVar77 != 0) {
          for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar14 = (int)pGVar15[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar195 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar195 = vinsertps_avx(auVar195,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar85 = vsubps_avx(auVar25,auVar195);
      uVar139 = auVar85._0_4_;
      auVar147._4_4_ = uVar139;
      auVar147._0_4_ = uVar139;
      auVar147._8_4_ = uVar139;
      auVar147._12_4_ = uVar139;
      auVar12 = vshufps_avx(auVar85,auVar85,0x55);
      auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
      aVar6 = (local_588->vx).field_0;
      aVar7 = (local_588->vy).field_0;
      fVar150 = (local_588->vz).field_0.m128[0];
      fVar138 = *(float *)((long)&(local_588->vz).field_0 + 4);
      fVar141 = *(float *)((long)&(local_588->vz).field_0 + 8);
      fVar142 = *(float *)((long)&(local_588->vz).field_0 + 0xc);
      auVar175._0_4_ = fVar150 * auVar85._0_4_;
      auVar175._4_4_ = fVar138 * auVar85._4_4_;
      auVar175._8_4_ = fVar141 * auVar85._8_4_;
      auVar175._12_4_ = fVar142 * auVar85._12_4_;
      auVar12 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar7,auVar12);
      auVar175 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar6,auVar147);
      auVar12 = vshufps_avx(auVar25,auVar25,0xff);
      auVar147 = vsubps_avx(auVar87,auVar195);
      uVar139 = auVar147._0_4_;
      auVar151._4_4_ = uVar139;
      auVar151._0_4_ = uVar139;
      auVar151._8_4_ = uVar139;
      auVar151._12_4_ = uVar139;
      auVar85 = vshufps_avx(auVar147,auVar147,0x55);
      auVar147 = vshufps_avx(auVar147,auVar147,0xaa);
      auVar176._0_4_ = fVar150 * auVar147._0_4_;
      auVar176._4_4_ = fVar138 * auVar147._4_4_;
      auVar176._8_4_ = fVar141 * auVar147._8_4_;
      auVar176._12_4_ = fVar142 * auVar147._12_4_;
      auVar85 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar7,auVar85);
      auVar151 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar6,auVar151);
      auVar87 = vshufps_avx(auVar87,auVar87,0xff);
      auVar147 = vsubps_avx(auVar86,auVar195);
      uVar139 = auVar147._0_4_;
      auVar172._4_4_ = uVar139;
      auVar172._0_4_ = uVar139;
      auVar172._8_4_ = uVar139;
      auVar172._12_4_ = uVar139;
      auVar85 = vshufps_avx(auVar147,auVar147,0x55);
      auVar147 = vshufps_avx(auVar147,auVar147,0xaa);
      auVar89._0_4_ = fVar150 * auVar147._0_4_;
      auVar89._4_4_ = fVar138 * auVar147._4_4_;
      auVar89._8_4_ = fVar141 * auVar147._8_4_;
      auVar89._12_4_ = fVar142 * auVar147._12_4_;
      auVar85 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar7,auVar85);
      auVar147 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar6,auVar172);
      auVar86 = vshufps_avx(auVar86,auVar86,0xff);
      auVar31._12_4_ = fStack_594;
      auVar31._0_12_ = *pauVar5;
      auVar85 = vsubps_avx512vl(auVar31,auVar195);
      uVar139 = auVar85._0_4_;
      auVar88._4_4_ = uVar139;
      auVar88._0_4_ = uVar139;
      auVar88._8_4_ = uVar139;
      auVar88._12_4_ = uVar139;
      auVar195 = vshufps_avx(auVar85,auVar85,0x55);
      auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
      auVar179._0_4_ = fVar150 * auVar85._0_4_;
      auVar179._4_4_ = fVar138 * auVar85._4_4_;
      auVar179._8_4_ = fVar141 * auVar85._8_4_;
      auVar179._12_4_ = fVar142 * auVar85._12_4_;
      auVar195 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar7,auVar195);
      auVar195 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar6,auVar88);
      lVar29 = (long)iVar14 * 0x44;
      auVar93 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar29);
      auVar85 = vshufps_avx512vl(auVar31,auVar31,0xff);
      local_4e0 = vbroadcastss_avx512vl(auVar175);
      auVar158._8_4_ = 1;
      auVar158._0_8_ = 0x100000001;
      auVar158._12_4_ = 1;
      auVar158._16_4_ = 1;
      auVar158._20_4_ = 1;
      auVar158._24_4_ = 1;
      auVar158._28_4_ = 1;
      local_500 = vpermps_avx512vl(auVar158,ZEXT1632(auVar175));
      uVar143 = auVar12._0_8_;
      local_a0._8_8_ = uVar143;
      local_a0._0_8_ = uVar143;
      local_a0._16_8_ = uVar143;
      local_a0._24_8_ = uVar143;
      auVar94 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar29 + 0x484);
      local_540 = vbroadcastss_avx512vl(auVar151);
      local_560 = vpermps_avx2(auVar158,ZEXT1632(auVar151));
      uVar143 = auVar87._0_8_;
      local_c0._8_8_ = uVar143;
      local_c0._0_8_ = uVar143;
      local_c0._16_8_ = uVar143;
      local_c0._24_8_ = uVar143;
      auVar95 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar29 + 0x908);
      uVar139 = auVar147._0_4_;
      local_660._4_4_ = uVar139;
      local_660._0_4_ = uVar139;
      local_660._8_4_ = uVar139;
      local_660._12_4_ = uVar139;
      local_660._16_4_ = uVar139;
      local_660._20_4_ = uVar139;
      local_660._24_4_ = uVar139;
      local_660._28_4_ = uVar139;
      local_640 = vpermps_avx512vl(auVar158,ZEXT1632(auVar147));
      auVar197 = ZEXT3264(local_640);
      local_e0 = vbroadcastsd_avx512vl(auVar86);
      auVar107 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar29 + 0xd8c);
      local_600 = vbroadcastss_avx512vl(auVar195);
      auVar200 = ZEXT3264(local_600);
      local_620 = vpermps_avx512vl(auVar158,ZEXT1632(auVar195));
      auVar199 = ZEXT3264(local_620);
      _local_100 = vbroadcastsd_avx512vl(auVar85);
      auVar97 = vmulps_avx512vl(local_600,auVar107);
      auVar98 = vmulps_avx512vl(local_620,auVar107);
      auVar87 = vfmadd231ps_fma(auVar97,auVar95,local_660);
      auVar97 = vfmadd231ps_avx512vl(auVar98,auVar95,local_640);
      auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar94,local_540);
      auVar87 = vfmadd231ps_fma(auVar97,auVar94,local_560);
      auVar99 = vfmadd231ps_avx512vl(auVar98,auVar93,local_4e0);
      auVar97 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar29);
      auVar98 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar29 + 0x484);
      auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar93,local_500);
      auVar106 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar29 + 0x908);
      auVar108 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar29 + 0xd8c);
      auVar100 = vmulps_avx512vl(local_600,auVar108);
      auVar101 = vmulps_avx512vl(local_620,auVar108);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar106,local_660);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar106,local_640);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar98,local_540);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar98,local_560);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar97,local_4e0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,local_500);
      auVar90 = vsubps_avx512vl(auVar100,auVar99);
      auVar91 = vsubps_avx512vl(auVar101,auVar92);
      auVar102 = vmulps_avx512vl(auVar92,auVar90);
      auVar103 = vmulps_avx512vl(auVar99,auVar91);
      auVar102 = vsubps_avx512vl(auVar102,auVar103);
      auVar103 = vmulps_avx512vl(_local_100,auVar107);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar95,local_e0);
      auVar87 = vfmadd231ps_fma(auVar103,auVar94,local_c0);
      auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar93,local_a0);
      auVar104 = vmulps_avx512vl(_local_100,auVar108);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar106,local_e0);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar98,local_c0);
      auVar12 = vfmadd231ps_fma(auVar104,auVar97,local_a0);
      auVar104 = vmulps_avx512vl(auVar91,auVar91);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar90,auVar90);
      auVar105 = vmaxps_avx512vl(auVar103,ZEXT1632(auVar12));
      auVar105 = vmulps_avx512vl(auVar105,auVar105);
      auVar104 = vmulps_avx512vl(auVar105,auVar104);
      auVar102 = vmulps_avx512vl(auVar102,auVar102);
      uVar143 = vcmpps_avx512vl(auVar102,auVar104,2);
      auVar87 = vblendps_avx(auVar175,auVar25,8);
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar86 = vandps_avx512vl(auVar87,auVar85);
      auVar87 = vblendps_avx(auVar151,*pauVar3,8);
      auVar87 = vandps_avx512vl(auVar87,auVar85);
      auVar86 = vmaxps_avx(auVar86,auVar87);
      auVar87 = vblendps_avx(auVar147,*pauVar4,8);
      auVar88 = vandps_avx512vl(auVar87,auVar85);
      auVar87 = vblendps_avx(auVar195,auVar31,8);
      auVar87 = vandps_avx512vl(auVar87,auVar85);
      auVar87 = vmaxps_avx(auVar88,auVar87);
      auVar87 = vmaxps_avx(auVar86,auVar87);
      auVar86 = vmovshdup_avx(auVar87);
      auVar86 = vmaxss_avx(auVar86,auVar87);
      auVar87 = vshufpd_avx(auVar87,auVar87,1);
      auVar87 = vmaxss_avx(auVar87,auVar86);
      auVar180._0_4_ = (float)iVar14;
      local_460._4_12_ = auVar175._4_12_;
      local_460._0_4_ = auVar180._0_4_;
      local_460._16_16_ = auVar96._16_16_;
      auVar180._4_4_ = auVar180._0_4_;
      auVar180._8_4_ = auVar180._0_4_;
      auVar180._12_4_ = auVar180._0_4_;
      auVar180._16_4_ = auVar180._0_4_;
      auVar180._20_4_ = auVar180._0_4_;
      auVar180._24_4_ = auVar180._0_4_;
      auVar180._28_4_ = auVar180._0_4_;
      uVar27 = vcmpps_avx512vl(auVar180,_DAT_01faff40,0xe);
      bVar82 = (byte)uVar143 & (byte)uVar27;
      local_400 = auVar87._0_4_ * 4.7683716e-07;
      auVar156._8_4_ = 2;
      auVar156._0_8_ = 0x200000002;
      auVar156._12_4_ = 2;
      auVar156._16_4_ = 2;
      auVar156._20_4_ = 2;
      auVar156._24_4_ = 2;
      auVar156._28_4_ = 2;
      local_120 = vpermps_avx512vl(auVar156,ZEXT1632(auVar175));
      local_140 = vpermps_avx512vl(auVar156,ZEXT1632(auVar151));
      local_160 = vpermps_avx512vl(auVar156,ZEXT1632(auVar147));
      local_5e0 = vpermps_avx2(auVar156,ZEXT1632(auVar195));
      uVar178 = *(uint *)(ray + k * 4 + 0x60);
      fStack_3fc = 0.0;
      fStack_3f8 = 0.0;
      fStack_3f4 = 0.0;
      auVar87 = auVar91._0_16_;
      if (bVar82 == 0) {
        bVar78 = false;
        auVar87 = vxorps_avx512vl(auVar87,auVar87);
        auVar196 = ZEXT1664(auVar87);
        auVar192 = ZEXT3264(local_4e0);
        auVar193 = ZEXT3264(local_500);
        auVar194 = ZEXT3264(local_540);
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar198 = ZEXT3264(auVar96);
        auVar191 = ZEXT3264(local_560);
        auVar190 = ZEXT3264(local_660);
      }
      else {
        local_580._0_16_ = ZEXT416(uVar178);
        auVar96 = vmulps_avx512vl(local_5e0,auVar108);
        auVar96 = vfmadd213ps_avx512vl(auVar106,local_160,auVar96);
        auVar96 = vfmadd213ps_avx512vl(auVar98,local_140,auVar96);
        auVar97 = vfmadd213ps_avx512vl(auVar97,local_120,auVar96);
        auVar96 = vmulps_avx512vl(local_5e0,auVar107);
        auVar96 = vfmadd213ps_avx512vl(auVar95,local_160,auVar96);
        auVar98 = vfmadd213ps_avx512vl(auVar94,local_140,auVar96);
        auVar96 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar29 + 0x1210);
        auVar94 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar29 + 0x1694);
        auVar95 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar29 + 0x1b18);
        auVar107 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar29 + 0x1f9c);
        auVar98 = vfmadd213ps_avx512vl(auVar93,local_120,auVar98);
        auVar93 = vmulps_avx512vl(local_600,auVar107);
        auVar106 = vmulps_avx512vl(local_620,auVar107);
        auVar107 = vmulps_avx512vl(local_5e0,auVar107);
        auVar86 = vfmadd231ps_fma(auVar93,auVar95,local_660);
        auVar93 = vfmadd231ps_avx512vl(auVar106,auVar95,local_640);
        auVar95 = vfmadd231ps_avx512vl(auVar107,local_160,auVar95);
        auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar94,local_540);
        auVar191 = ZEXT3264(local_560);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar94,local_560);
        auVar106 = vfmadd231ps_avx512vl(auVar95,local_140,auVar94);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar96,local_4e0);
        auVar108 = vfmadd231ps_avx512vl(auVar93,auVar96,local_500);
        auVar93 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar29 + 0x1210);
        auVar94 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar29 + 0x1b18);
        auVar95 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar29 + 0x1f9c);
        auVar106 = vfmadd231ps_avx512vl(auVar106,local_120,auVar96);
        auVar96 = vmulps_avx512vl(local_600,auVar95);
        auVar102 = vmulps_avx512vl(local_620,auVar95);
        auVar95 = vmulps_avx512vl(local_5e0,auVar95);
        auVar86 = vfmadd231ps_fma(auVar96,auVar94,local_660);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar94,local_640);
        auVar94 = vfmadd231ps_avx512vl(auVar95,local_160,auVar94);
        auVar96 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar29 + 0x1694);
        auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar96,local_540);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar96,local_560);
        auVar96 = vfmadd231ps_avx512vl(auVar94,local_140,auVar96);
        auVar94 = vfmadd231ps_avx512vl(auVar95,auVar93,local_4e0);
        auVar95 = vfmadd231ps_avx512vl(auVar102,auVar93,local_500);
        auVar102 = vfmadd231ps_avx512vl(auVar96,local_120,auVar93);
        auVar188._8_4_ = 0x7fffffff;
        auVar188._0_8_ = 0x7fffffff7fffffff;
        auVar188._12_4_ = 0x7fffffff;
        auVar188._16_4_ = 0x7fffffff;
        auVar188._20_4_ = 0x7fffffff;
        auVar188._24_4_ = 0x7fffffff;
        auVar188._28_4_ = 0x7fffffff;
        auVar96 = vandps_avx(auVar107,auVar188);
        auVar93 = vandps_avx(auVar108,auVar188);
        auVar93 = vmaxps_avx(auVar96,auVar93);
        auVar96 = vandps_avx(auVar106,auVar188);
        auVar96 = vmaxps_avx(auVar93,auVar96);
        auVar106 = vbroadcastss_avx512vl(ZEXT416((uint)local_400));
        uVar76 = vcmpps_avx512vl(auVar96,auVar106,1);
        bVar78 = (bool)((byte)uVar76 & 1);
        auVar109._0_4_ = (float)((uint)bVar78 * auVar90._0_4_ | (uint)!bVar78 * auVar107._0_4_);
        bVar78 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar78 * auVar90._4_4_ | (uint)!bVar78 * auVar107._4_4_);
        bVar78 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar78 * auVar90._8_4_ | (uint)!bVar78 * auVar107._8_4_);
        bVar78 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar78 * auVar90._12_4_ | (uint)!bVar78 * auVar107._12_4_);
        bVar78 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar109._16_4_ = (float)((uint)bVar78 * auVar90._16_4_ | (uint)!bVar78 * auVar107._16_4_);
        bVar78 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar109._20_4_ = (float)((uint)bVar78 * auVar90._20_4_ | (uint)!bVar78 * auVar107._20_4_);
        bVar78 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar109._24_4_ = (float)((uint)bVar78 * auVar90._24_4_ | (uint)!bVar78 * auVar107._24_4_);
        bVar78 = SUB81(uVar76 >> 7,0);
        auVar109._28_4_ = (uint)bVar78 * auVar90._28_4_ | (uint)!bVar78 * auVar107._28_4_;
        bVar78 = (bool)((byte)uVar76 & 1);
        auVar110._0_4_ = (float)((uint)bVar78 * auVar91._0_4_ | (uint)!bVar78 * auVar108._0_4_);
        bVar78 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar78 * auVar91._4_4_ | (uint)!bVar78 * auVar108._4_4_);
        bVar78 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar78 * auVar91._8_4_ | (uint)!bVar78 * auVar108._8_4_);
        bVar78 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar78 * auVar91._12_4_ | (uint)!bVar78 * auVar108._12_4_);
        bVar78 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar110._16_4_ = (float)((uint)bVar78 * auVar91._16_4_ | (uint)!bVar78 * auVar108._16_4_);
        bVar78 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar110._20_4_ = (float)((uint)bVar78 * auVar91._20_4_ | (uint)!bVar78 * auVar108._20_4_);
        bVar78 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar110._24_4_ = (float)((uint)bVar78 * auVar91._24_4_ | (uint)!bVar78 * auVar108._24_4_);
        bVar78 = SUB81(uVar76 >> 7,0);
        auVar110._28_4_ = (uint)bVar78 * auVar91._28_4_ | (uint)!bVar78 * auVar108._28_4_;
        auVar96 = vandps_avx(auVar188,auVar94);
        auVar93 = vandps_avx(auVar95,auVar188);
        auVar93 = vmaxps_avx(auVar96,auVar93);
        auVar96 = vandps_avx(auVar102,auVar188);
        auVar96 = vmaxps_avx(auVar93,auVar96);
        uVar76 = vcmpps_avx512vl(auVar96,auVar106,1);
        bVar78 = (bool)((byte)uVar76 & 1);
        auVar111._0_4_ = (float)((uint)bVar78 * auVar90._0_4_ | (uint)!bVar78 * auVar94._0_4_);
        bVar78 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar78 * auVar90._4_4_ | (uint)!bVar78 * auVar94._4_4_);
        bVar78 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar78 * auVar90._8_4_ | (uint)!bVar78 * auVar94._8_4_);
        bVar78 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar78 * auVar90._12_4_ | (uint)!bVar78 * auVar94._12_4_);
        bVar78 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar78 * auVar90._16_4_ | (uint)!bVar78 * auVar94._16_4_);
        bVar78 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar78 * auVar90._20_4_ | (uint)!bVar78 * auVar94._20_4_);
        bVar78 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar78 * auVar90._24_4_ | (uint)!bVar78 * auVar94._24_4_);
        bVar78 = SUB81(uVar76 >> 7,0);
        auVar111._28_4_ = (uint)bVar78 * auVar90._28_4_ | (uint)!bVar78 * auVar94._28_4_;
        bVar78 = (bool)((byte)uVar76 & 1);
        auVar112._0_4_ = (float)((uint)bVar78 * auVar91._0_4_ | (uint)!bVar78 * auVar95._0_4_);
        bVar78 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar78 * auVar91._4_4_ | (uint)!bVar78 * auVar95._4_4_);
        bVar78 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar78 * auVar91._8_4_ | (uint)!bVar78 * auVar95._8_4_);
        bVar78 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar78 * auVar91._12_4_ | (uint)!bVar78 * auVar95._12_4_);
        bVar78 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar112._16_4_ = (float)((uint)bVar78 * auVar91._16_4_ | (uint)!bVar78 * auVar95._16_4_);
        bVar78 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar112._20_4_ = (float)((uint)bVar78 * auVar91._20_4_ | (uint)!bVar78 * auVar95._20_4_);
        bVar78 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar112._24_4_ = (float)((uint)bVar78 * auVar91._24_4_ | (uint)!bVar78 * auVar95._24_4_);
        bVar78 = SUB81(uVar76 >> 7,0);
        auVar112._28_4_ = (uint)bVar78 * auVar91._28_4_ | (uint)!bVar78 * auVar95._28_4_;
        auVar89 = vxorps_avx512vl(auVar87,auVar87);
        auVar196 = ZEXT1664(auVar89);
        auVar96 = vfmadd213ps_avx512vl(auVar109,auVar109,ZEXT1632(auVar89));
        auVar87 = vfmadd231ps_fma(auVar96,auVar110,auVar110);
        auVar96 = vrsqrt14ps_avx512vl(ZEXT1632(auVar87));
        fVar150 = auVar96._0_4_;
        fVar138 = auVar96._4_4_;
        fVar141 = auVar96._8_4_;
        fVar142 = auVar96._12_4_;
        fVar169 = auVar96._16_4_;
        fVar171 = auVar96._20_4_;
        fVar83 = auVar96._24_4_;
        auVar37._4_4_ = fVar138 * fVar138 * fVar138 * auVar87._4_4_ * -0.5;
        auVar37._0_4_ = fVar150 * fVar150 * fVar150 * auVar87._0_4_ * -0.5;
        auVar37._8_4_ = fVar141 * fVar141 * fVar141 * auVar87._8_4_ * -0.5;
        auVar37._12_4_ = fVar142 * fVar142 * fVar142 * auVar87._12_4_ * -0.5;
        auVar37._16_4_ = fVar169 * fVar169 * fVar169 * -0.0;
        auVar37._20_4_ = fVar171 * fVar171 * fVar171 * -0.0;
        auVar37._24_4_ = fVar83 * fVar83 * fVar83 * -0.0;
        auVar37._28_4_ = 0;
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar94 = vfmadd231ps_avx512vl(auVar37,auVar93,auVar96);
        auVar38._4_4_ = auVar110._4_4_ * auVar94._4_4_;
        auVar38._0_4_ = auVar110._0_4_ * auVar94._0_4_;
        auVar38._8_4_ = auVar110._8_4_ * auVar94._8_4_;
        auVar38._12_4_ = auVar110._12_4_ * auVar94._12_4_;
        auVar38._16_4_ = auVar110._16_4_ * auVar94._16_4_;
        auVar38._20_4_ = auVar110._20_4_ * auVar94._20_4_;
        auVar38._24_4_ = auVar110._24_4_ * auVar94._24_4_;
        auVar38._28_4_ = auVar96._28_4_;
        auVar39._4_4_ = auVar94._4_4_ * -auVar109._4_4_;
        auVar39._0_4_ = auVar94._0_4_ * -auVar109._0_4_;
        auVar39._8_4_ = auVar94._8_4_ * -auVar109._8_4_;
        auVar39._12_4_ = auVar94._12_4_ * -auVar109._12_4_;
        auVar39._16_4_ = auVar94._16_4_ * -auVar109._16_4_;
        auVar39._20_4_ = auVar94._20_4_ * -auVar109._20_4_;
        auVar39._24_4_ = auVar94._24_4_ * -auVar109._24_4_;
        auVar39._28_4_ = auVar109._28_4_ ^ 0x80000000;
        auVar96 = vmulps_avx512vl(auVar94,ZEXT1632(auVar89));
        auVar108 = ZEXT1632(auVar89);
        auVar95 = vfmadd213ps_avx512vl(auVar111,auVar111,auVar108);
        auVar87 = vfmadd231ps_fma(auVar95,auVar112,auVar112);
        auVar95 = vrsqrt14ps_avx512vl(ZEXT1632(auVar87));
        fVar150 = auVar95._0_4_;
        fVar138 = auVar95._4_4_;
        fVar141 = auVar95._8_4_;
        fVar142 = auVar95._12_4_;
        fVar169 = auVar95._16_4_;
        fVar171 = auVar95._20_4_;
        fVar83 = auVar95._24_4_;
        auVar40._4_4_ = fVar138 * fVar138 * fVar138 * auVar87._4_4_ * -0.5;
        auVar40._0_4_ = fVar150 * fVar150 * fVar150 * auVar87._0_4_ * -0.5;
        auVar40._8_4_ = fVar141 * fVar141 * fVar141 * auVar87._8_4_ * -0.5;
        auVar40._12_4_ = fVar142 * fVar142 * fVar142 * auVar87._12_4_ * -0.5;
        auVar40._16_4_ = fVar169 * fVar169 * fVar169 * -0.0;
        auVar40._20_4_ = fVar171 * fVar171 * fVar171 * -0.0;
        auVar40._24_4_ = fVar83 * fVar83 * fVar83 * -0.0;
        auVar40._28_4_ = 0;
        auVar93 = vfmadd231ps_avx512vl(auVar40,auVar93,auVar95);
        auVar41._4_4_ = auVar112._4_4_ * auVar93._4_4_;
        auVar41._0_4_ = auVar112._0_4_ * auVar93._0_4_;
        auVar41._8_4_ = auVar112._8_4_ * auVar93._8_4_;
        auVar41._12_4_ = auVar112._12_4_ * auVar93._12_4_;
        auVar41._16_4_ = auVar112._16_4_ * auVar93._16_4_;
        auVar41._20_4_ = auVar112._20_4_ * auVar93._20_4_;
        auVar41._24_4_ = auVar112._24_4_ * auVar93._24_4_;
        auVar41._28_4_ = auVar95._28_4_;
        auVar42._4_4_ = -auVar111._4_4_ * auVar93._4_4_;
        auVar42._0_4_ = -auVar111._0_4_ * auVar93._0_4_;
        auVar42._8_4_ = -auVar111._8_4_ * auVar93._8_4_;
        auVar42._12_4_ = -auVar111._12_4_ * auVar93._12_4_;
        auVar42._16_4_ = -auVar111._16_4_ * auVar93._16_4_;
        auVar42._20_4_ = -auVar111._20_4_ * auVar93._20_4_;
        auVar42._24_4_ = -auVar111._24_4_ * auVar93._24_4_;
        auVar42._28_4_ = auVar94._28_4_;
        auVar93 = vmulps_avx512vl(auVar93,auVar108);
        auVar87 = vfmadd213ps_fma(auVar38,auVar103,auVar99);
        auVar86 = vfmadd213ps_fma(auVar39,auVar103,auVar92);
        auVar94 = vfmadd213ps_avx512vl(auVar96,auVar103,auVar98);
        auVar95 = vfmadd213ps_avx512vl(auVar41,ZEXT1632(auVar12),auVar100);
        auVar151 = vfnmadd213ps_fma(auVar38,auVar103,auVar99);
        auVar106 = ZEXT1632(auVar12);
        auVar195 = vfmadd213ps_fma(auVar42,auVar106,auVar101);
        auVar31 = vfnmadd213ps_fma(auVar39,auVar103,auVar92);
        auVar85 = vfmadd213ps_fma(auVar93,auVar106,auVar97);
        auVar107 = vfnmadd231ps_avx512vl(auVar98,auVar103,auVar96);
        auVar88 = vfnmadd213ps_fma(auVar41,auVar106,auVar100);
        auVar172 = vfnmadd213ps_fma(auVar42,auVar106,auVar101);
        auVar176 = vfnmadd231ps_fma(auVar97,ZEXT1632(auVar12),auVar93);
        auVar93 = vsubps_avx512vl(auVar95,ZEXT1632(auVar151));
        auVar96 = vsubps_avx(ZEXT1632(auVar195),ZEXT1632(auVar31));
        auVar97 = vsubps_avx512vl(ZEXT1632(auVar85),auVar107);
        auVar98 = vmulps_avx512vl(auVar96,auVar107);
        auVar147 = vfmsub231ps_fma(auVar98,ZEXT1632(auVar31),auVar97);
        auVar43._4_4_ = auVar151._4_4_ * auVar97._4_4_;
        auVar43._0_4_ = auVar151._0_4_ * auVar97._0_4_;
        auVar43._8_4_ = auVar151._8_4_ * auVar97._8_4_;
        auVar43._12_4_ = auVar151._12_4_ * auVar97._12_4_;
        auVar43._16_4_ = auVar97._16_4_ * 0.0;
        auVar43._20_4_ = auVar97._20_4_ * 0.0;
        auVar43._24_4_ = auVar97._24_4_ * 0.0;
        auVar43._28_4_ = auVar97._28_4_;
        auVar97 = vfmsub231ps_avx512vl(auVar43,auVar107,auVar93);
        auVar44._4_4_ = auVar31._4_4_ * auVar93._4_4_;
        auVar44._0_4_ = auVar31._0_4_ * auVar93._0_4_;
        auVar44._8_4_ = auVar31._8_4_ * auVar93._8_4_;
        auVar44._12_4_ = auVar31._12_4_ * auVar93._12_4_;
        auVar44._16_4_ = auVar93._16_4_ * 0.0;
        auVar44._20_4_ = auVar93._20_4_ * 0.0;
        auVar44._24_4_ = auVar93._24_4_ * 0.0;
        auVar44._28_4_ = auVar93._28_4_;
        auVar175 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar151),auVar96);
        auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar175),auVar108,auVar97);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar108,ZEXT1632(auVar147));
        auVar100 = ZEXT1632(auVar89);
        uVar76 = vcmpps_avx512vl(auVar96,auVar100,2);
        bVar75 = (byte)uVar76;
        fVar83 = (float)((uint)(bVar75 & 1) * auVar87._0_4_ |
                        (uint)!(bool)(bVar75 & 1) * auVar88._0_4_);
        bVar78 = (bool)((byte)(uVar76 >> 1) & 1);
        fVar149 = (float)((uint)bVar78 * auVar87._4_4_ | (uint)!bVar78 * auVar88._4_4_);
        bVar78 = (bool)((byte)(uVar76 >> 2) & 1);
        fVar131 = (float)((uint)bVar78 * auVar87._8_4_ | (uint)!bVar78 * auVar88._8_4_);
        bVar78 = (bool)((byte)(uVar76 >> 3) & 1);
        fVar134 = (float)((uint)bVar78 * auVar87._12_4_ | (uint)!bVar78 * auVar88._12_4_);
        auVar98 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar131,CONCAT44(fVar149,fVar83))));
        fVar84 = (float)((uint)(bVar75 & 1) * auVar86._0_4_ |
                        (uint)!(bool)(bVar75 & 1) * auVar172._0_4_);
        bVar78 = (bool)((byte)(uVar76 >> 1) & 1);
        fVar130 = (float)((uint)bVar78 * auVar86._4_4_ | (uint)!bVar78 * auVar172._4_4_);
        bVar78 = (bool)((byte)(uVar76 >> 2) & 1);
        fVar132 = (float)((uint)bVar78 * auVar86._8_4_ | (uint)!bVar78 * auVar172._8_4_);
        bVar78 = (bool)((byte)(uVar76 >> 3) & 1);
        fVar135 = (float)((uint)bVar78 * auVar86._12_4_ | (uint)!bVar78 * auVar172._12_4_);
        auVar106 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar132,CONCAT44(fVar130,fVar84))));
        auVar113._0_4_ =
             (float)((uint)(bVar75 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar176._0_4_
                    );
        bVar78 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar78 * auVar94._4_4_ | (uint)!bVar78 * auVar176._4_4_);
        bVar78 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar78 * auVar94._8_4_ | (uint)!bVar78 * auVar176._8_4_);
        bVar78 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar78 * auVar94._12_4_ | (uint)!bVar78 * auVar176._12_4_);
        fVar150 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar94._16_4_);
        auVar113._16_4_ = fVar150;
        fVar141 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar94._20_4_);
        auVar113._20_4_ = fVar141;
        fVar138 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar94._24_4_);
        auVar113._24_4_ = fVar138;
        iVar1 = (uint)(byte)(uVar76 >> 7) * auVar94._28_4_;
        auVar113._28_4_ = iVar1;
        auVar93 = vblendmps_avx512vl(ZEXT1632(auVar151),auVar95);
        auVar114._0_4_ =
             (uint)(bVar75 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar147._0_4_;
        bVar78 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar114._4_4_ = (uint)bVar78 * auVar93._4_4_ | (uint)!bVar78 * auVar147._4_4_;
        bVar78 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar114._8_4_ = (uint)bVar78 * auVar93._8_4_ | (uint)!bVar78 * auVar147._8_4_;
        bVar78 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar114._12_4_ = (uint)bVar78 * auVar93._12_4_ | (uint)!bVar78 * auVar147._12_4_;
        auVar114._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * auVar93._16_4_;
        auVar114._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * auVar93._20_4_;
        auVar114._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * auVar93._24_4_;
        auVar114._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar93._28_4_;
        auVar93 = vblendmps_avx512vl(ZEXT1632(auVar31),ZEXT1632(auVar195));
        auVar115._0_4_ =
             (float)((uint)(bVar75 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar86._0_4_)
        ;
        bVar78 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar78 * auVar93._4_4_ | (uint)!bVar78 * auVar86._4_4_);
        bVar78 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar78 * auVar93._8_4_ | (uint)!bVar78 * auVar86._8_4_);
        bVar78 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar78 * auVar93._12_4_ | (uint)!bVar78 * auVar86._12_4_);
        fVar171 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar93._16_4_);
        auVar115._16_4_ = fVar171;
        fVar169 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar93._20_4_);
        auVar115._20_4_ = fVar169;
        fVar142 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar93._24_4_);
        auVar115._24_4_ = fVar142;
        auVar115._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar93._28_4_;
        auVar93 = vblendmps_avx512vl(auVar107,ZEXT1632(auVar85));
        auVar116._0_4_ =
             (float)((uint)(bVar75 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar94._0_4_)
        ;
        bVar78 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar78 * auVar93._4_4_ | (uint)!bVar78 * auVar94._4_4_);
        bVar78 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar78 * auVar93._8_4_ | (uint)!bVar78 * auVar94._8_4_);
        bVar78 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar78 * auVar93._12_4_ | (uint)!bVar78 * auVar94._12_4_);
        bVar78 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar78 * auVar93._16_4_ | (uint)!bVar78 * auVar94._16_4_);
        bVar78 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar78 * auVar93._20_4_ | (uint)!bVar78 * auVar94._20_4_);
        bVar78 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar78 * auVar93._24_4_ | (uint)!bVar78 * auVar94._24_4_);
        bVar78 = SUB81(uVar76 >> 7,0);
        auVar116._28_4_ = (uint)bVar78 * auVar93._28_4_ | (uint)!bVar78 * auVar94._28_4_;
        auVar117._0_4_ =
             (uint)(bVar75 & 1) * (int)auVar151._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar95._0_4_;
        bVar78 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar117._4_4_ = (uint)bVar78 * (int)auVar151._4_4_ | (uint)!bVar78 * auVar95._4_4_;
        bVar78 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar117._8_4_ = (uint)bVar78 * (int)auVar151._8_4_ | (uint)!bVar78 * auVar95._8_4_;
        bVar78 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar117._12_4_ = (uint)bVar78 * (int)auVar151._12_4_ | (uint)!bVar78 * auVar95._12_4_;
        auVar117._16_4_ = (uint)!(bool)((byte)(uVar76 >> 4) & 1) * auVar95._16_4_;
        auVar117._20_4_ = (uint)!(bool)((byte)(uVar76 >> 5) & 1) * auVar95._20_4_;
        auVar117._24_4_ = (uint)!(bool)((byte)(uVar76 >> 6) & 1) * auVar95._24_4_;
        auVar117._28_4_ = (uint)!SUB81(uVar76 >> 7,0) * auVar95._28_4_;
        bVar78 = (bool)((byte)(uVar76 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar76 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar118._0_4_ =
             (uint)(bVar75 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar85._0_4_;
        bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar118._4_4_ = (uint)bVar17 * auVar107._4_4_ | (uint)!bVar17 * auVar85._4_4_;
        bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar118._8_4_ = (uint)bVar17 * auVar107._8_4_ | (uint)!bVar17 * auVar85._8_4_;
        bVar17 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar118._12_4_ = (uint)bVar17 * auVar107._12_4_ | (uint)!bVar17 * auVar85._12_4_;
        auVar118._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * auVar107._16_4_;
        auVar118._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * auVar107._20_4_;
        auVar118._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * auVar107._24_4_;
        iVar2 = (uint)(byte)(uVar76 >> 7) * auVar107._28_4_;
        auVar118._28_4_ = iVar2;
        auVar108 = vsubps_avx512vl(auVar117,auVar98);
        auVar93 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar31._12_4_ |
                                                (uint)!bVar19 * auVar195._12_4_,
                                                CONCAT48((uint)bVar18 * (int)auVar31._8_4_ |
                                                         (uint)!bVar18 * auVar195._8_4_,
                                                         CONCAT44((uint)bVar78 * (int)auVar31._4_4_
                                                                  | (uint)!bVar78 * auVar195._4_4_,
                                                                  (uint)(bVar75 & 1) *
                                                                  (int)auVar31._0_4_ |
                                                                  (uint)!(bool)(bVar75 & 1) *
                                                                  auVar195._0_4_)))),auVar106);
        auVar94 = vsubps_avx(auVar118,auVar113);
        auVar95 = vsubps_avx(auVar98,auVar114);
        auVar107 = vsubps_avx(auVar106,auVar115);
        auVar97 = vsubps_avx(auVar113,auVar116);
        auVar45._4_4_ = auVar94._4_4_ * fVar149;
        auVar45._0_4_ = auVar94._0_4_ * fVar83;
        auVar45._8_4_ = auVar94._8_4_ * fVar131;
        auVar45._12_4_ = auVar94._12_4_ * fVar134;
        auVar45._16_4_ = auVar94._16_4_ * 0.0;
        auVar45._20_4_ = auVar94._20_4_ * 0.0;
        auVar45._24_4_ = auVar94._24_4_ * 0.0;
        auVar45._28_4_ = iVar2;
        auVar87 = vfmsub231ps_fma(auVar45,auVar113,auVar108);
        auVar46._4_4_ = fVar130 * auVar108._4_4_;
        auVar46._0_4_ = fVar84 * auVar108._0_4_;
        auVar46._8_4_ = fVar132 * auVar108._8_4_;
        auVar46._12_4_ = fVar135 * auVar108._12_4_;
        auVar46._16_4_ = auVar108._16_4_ * 0.0;
        auVar46._20_4_ = auVar108._20_4_ * 0.0;
        auVar46._24_4_ = auVar108._24_4_ * 0.0;
        auVar46._28_4_ = auVar96._28_4_;
        auVar86 = vfmsub231ps_fma(auVar46,auVar98,auVar93);
        auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar100,ZEXT1632(auVar87));
        auVar159._0_4_ = auVar93._0_4_ * auVar113._0_4_;
        auVar159._4_4_ = auVar93._4_4_ * auVar113._4_4_;
        auVar159._8_4_ = auVar93._8_4_ * auVar113._8_4_;
        auVar159._12_4_ = auVar93._12_4_ * auVar113._12_4_;
        auVar159._16_4_ = auVar93._16_4_ * fVar150;
        auVar159._20_4_ = auVar93._20_4_ * fVar141;
        auVar159._24_4_ = auVar93._24_4_ * fVar138;
        auVar159._28_4_ = 0;
        auVar87 = vfmsub231ps_fma(auVar159,auVar106,auVar94);
        auVar99 = vfmadd231ps_avx512vl(auVar96,auVar100,ZEXT1632(auVar87));
        auVar96 = vmulps_avx512vl(auVar97,auVar114);
        auVar96 = vfmsub231ps_avx512vl(auVar96,auVar95,auVar116);
        auVar47._4_4_ = auVar107._4_4_ * auVar116._4_4_;
        auVar47._0_4_ = auVar107._0_4_ * auVar116._0_4_;
        auVar47._8_4_ = auVar107._8_4_ * auVar116._8_4_;
        auVar47._12_4_ = auVar107._12_4_ * auVar116._12_4_;
        auVar47._16_4_ = auVar107._16_4_ * auVar116._16_4_;
        auVar47._20_4_ = auVar107._20_4_ * auVar116._20_4_;
        auVar47._24_4_ = auVar107._24_4_ * auVar116._24_4_;
        auVar47._28_4_ = auVar116._28_4_;
        auVar87 = vfmsub231ps_fma(auVar47,auVar115,auVar97);
        auVar160._0_4_ = auVar115._0_4_ * auVar95._0_4_;
        auVar160._4_4_ = auVar115._4_4_ * auVar95._4_4_;
        auVar160._8_4_ = auVar115._8_4_ * auVar95._8_4_;
        auVar160._12_4_ = auVar115._12_4_ * auVar95._12_4_;
        auVar160._16_4_ = fVar171 * auVar95._16_4_;
        auVar160._20_4_ = fVar169 * auVar95._20_4_;
        auVar160._24_4_ = fVar142 * auVar95._24_4_;
        auVar160._28_4_ = 0;
        auVar86 = vfmsub231ps_fma(auVar160,auVar107,auVar114);
        auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar100,auVar96);
        auVar92 = vfmadd231ps_avx512vl(auVar96,auVar100,ZEXT1632(auVar87));
        auVar96 = vmaxps_avx(auVar99,auVar92);
        uVar143 = vcmpps_avx512vl(auVar96,auVar100,2);
        bVar82 = bVar82 & (byte)uVar143;
        auVar192 = ZEXT3264(local_4e0);
        auVar193 = ZEXT3264(local_500);
        auVar194 = ZEXT3264(local_540);
        auVar190 = ZEXT3264(local_660);
        if (bVar82 == 0) {
          bVar78 = false;
          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar198 = ZEXT3264(auVar96);
          auVar197 = ZEXT3264(local_640);
          auVar200 = ZEXT3264(local_600);
          auVar199 = ZEXT3264(local_620);
        }
        else {
          uVar139 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar183._4_4_ = uVar139;
          auVar183._0_4_ = uVar139;
          auVar183._8_4_ = uVar139;
          auVar183._12_4_ = uVar139;
          auVar183._16_4_ = uVar139;
          auVar183._20_4_ = uVar139;
          auVar183._24_4_ = uVar139;
          auVar183._28_4_ = uVar139;
          auVar185 = ZEXT3264(auVar183);
          auVar48._4_4_ = auVar97._4_4_ * auVar93._4_4_;
          auVar48._0_4_ = auVar97._0_4_ * auVar93._0_4_;
          auVar48._8_4_ = auVar97._8_4_ * auVar93._8_4_;
          auVar48._12_4_ = auVar97._12_4_ * auVar93._12_4_;
          auVar48._16_4_ = auVar97._16_4_ * auVar93._16_4_;
          auVar48._20_4_ = auVar97._20_4_ * auVar93._20_4_;
          auVar48._24_4_ = auVar97._24_4_ * auVar93._24_4_;
          auVar48._28_4_ = auVar96._28_4_;
          auVar195 = vfmsub231ps_fma(auVar48,auVar107,auVar94);
          auVar49._4_4_ = auVar94._4_4_ * auVar95._4_4_;
          auVar49._0_4_ = auVar94._0_4_ * auVar95._0_4_;
          auVar49._8_4_ = auVar94._8_4_ * auVar95._8_4_;
          auVar49._12_4_ = auVar94._12_4_ * auVar95._12_4_;
          auVar49._16_4_ = auVar94._16_4_ * auVar95._16_4_;
          auVar49._20_4_ = auVar94._20_4_ * auVar95._20_4_;
          auVar49._24_4_ = auVar94._24_4_ * auVar95._24_4_;
          auVar49._28_4_ = auVar94._28_4_;
          auVar86 = vfmsub231ps_fma(auVar49,auVar108,auVar97);
          auVar50._4_4_ = auVar107._4_4_ * auVar108._4_4_;
          auVar50._0_4_ = auVar107._0_4_ * auVar108._0_4_;
          auVar50._8_4_ = auVar107._8_4_ * auVar108._8_4_;
          auVar50._12_4_ = auVar107._12_4_ * auVar108._12_4_;
          auVar50._16_4_ = auVar107._16_4_ * auVar108._16_4_;
          auVar50._20_4_ = auVar107._20_4_ * auVar108._20_4_;
          auVar50._24_4_ = auVar107._24_4_ * auVar108._24_4_;
          auVar50._28_4_ = auVar107._28_4_;
          auVar85 = vfmsub231ps_fma(auVar50,auVar95,auVar93);
          auVar87 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar86),ZEXT1632(auVar85));
          auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),ZEXT1632(auVar195),auVar100);
          auVar93 = vrcp14ps_avx512vl(auVar96);
          auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar198 = ZEXT3264(auVar94);
          auVar95 = vfnmadd213ps_avx512vl(auVar93,auVar96,auVar94);
          auVar87 = vfmadd132ps_fma(auVar95,auVar93,auVar93);
          auVar51._4_4_ = auVar85._4_4_ * auVar113._4_4_;
          auVar51._0_4_ = auVar85._0_4_ * auVar113._0_4_;
          auVar51._8_4_ = auVar85._8_4_ * auVar113._8_4_;
          auVar51._12_4_ = auVar85._12_4_ * auVar113._12_4_;
          auVar51._16_4_ = fVar150 * 0.0;
          auVar51._20_4_ = fVar141 * 0.0;
          auVar51._24_4_ = fVar138 * 0.0;
          auVar51._28_4_ = iVar1;
          auVar86 = vfmadd231ps_fma(auVar51,auVar106,ZEXT1632(auVar86));
          auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar98,ZEXT1632(auVar195));
          fVar150 = auVar87._0_4_;
          fVar138 = auVar87._4_4_;
          fVar141 = auVar87._8_4_;
          fVar142 = auVar87._12_4_;
          local_3a0 = ZEXT1632(CONCAT412(auVar86._12_4_ * fVar142,
                                         CONCAT48(auVar86._8_4_ * fVar141,
                                                  CONCAT44(auVar86._4_4_ * fVar138,
                                                           auVar86._0_4_ * fVar150))));
          auVar174._4_4_ = uVar178;
          auVar174._0_4_ = uVar178;
          auVar174._8_4_ = uVar178;
          auVar174._12_4_ = uVar178;
          auVar174._16_4_ = uVar178;
          auVar174._20_4_ = uVar178;
          auVar174._24_4_ = uVar178;
          auVar174._28_4_ = uVar178;
          uVar143 = vcmpps_avx512vl(local_3a0,auVar183,2);
          uVar27 = vcmpps_avx512vl(auVar174,local_3a0,2);
          bVar82 = (byte)uVar143 & (byte)uVar27 & bVar82;
          auVar200 = ZEXT3264(local_600);
          auVar199 = ZEXT3264(local_620);
          if (bVar82 == 0) {
            bVar78 = false;
            auVar197 = ZEXT3264(local_640);
          }
          else {
            uVar143 = vcmpps_avx512vl(auVar96,auVar100,4);
            bVar82 = bVar82 & (byte)uVar143;
            auVar197 = ZEXT3264(local_640);
            if (bVar82 != 0) {
              fVar169 = auVar99._0_4_ * fVar150;
              fVar171 = auVar99._4_4_ * fVar138;
              auVar52._4_4_ = fVar171;
              auVar52._0_4_ = fVar169;
              fVar83 = auVar99._8_4_ * fVar141;
              auVar52._8_4_ = fVar83;
              fVar84 = auVar99._12_4_ * fVar142;
              auVar52._12_4_ = fVar84;
              fVar149 = auVar99._16_4_ * 0.0;
              auVar52._16_4_ = fVar149;
              fVar130 = auVar99._20_4_ * 0.0;
              auVar52._20_4_ = fVar130;
              fVar131 = auVar99._24_4_ * 0.0;
              auVar52._24_4_ = fVar131;
              auVar52._28_4_ = auVar96._28_4_;
              auVar93 = vsubps_avx512vl(auVar94,auVar52);
              local_3e0._0_4_ =
                   (float)((uint)(bVar75 & 1) * (int)fVar169 |
                          (uint)!(bool)(bVar75 & 1) * auVar93._0_4_);
              bVar78 = (bool)((byte)(uVar76 >> 1) & 1);
              local_3e0._4_4_ = (float)((uint)bVar78 * (int)fVar171 | (uint)!bVar78 * auVar93._4_4_)
              ;
              bVar78 = (bool)((byte)(uVar76 >> 2) & 1);
              local_3e0._8_4_ = (float)((uint)bVar78 * (int)fVar83 | (uint)!bVar78 * auVar93._8_4_);
              bVar78 = (bool)((byte)(uVar76 >> 3) & 1);
              local_3e0._12_4_ =
                   (float)((uint)bVar78 * (int)fVar84 | (uint)!bVar78 * auVar93._12_4_);
              bVar78 = (bool)((byte)(uVar76 >> 4) & 1);
              local_3e0._16_4_ =
                   (float)((uint)bVar78 * (int)fVar149 | (uint)!bVar78 * auVar93._16_4_);
              bVar78 = (bool)((byte)(uVar76 >> 5) & 1);
              local_3e0._20_4_ =
                   (float)((uint)bVar78 * (int)fVar130 | (uint)!bVar78 * auVar93._20_4_);
              bVar78 = (bool)((byte)(uVar76 >> 6) & 1);
              local_3e0._24_4_ =
                   (float)((uint)bVar78 * (int)fVar131 | (uint)!bVar78 * auVar93._24_4_);
              bVar78 = SUB81(uVar76 >> 7,0);
              local_3e0._28_4_ =
                   (float)((uint)bVar78 * auVar96._28_4_ | (uint)!bVar78 * auVar93._28_4_);
              auVar96 = vsubps_avx(ZEXT1632(auVar12),auVar103);
              auVar87 = vfmadd213ps_fma(auVar96,local_3e0,auVar103);
              uVar139 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar32._4_4_ = uVar139;
              auVar32._0_4_ = uVar139;
              auVar32._8_4_ = uVar139;
              auVar32._12_4_ = uVar139;
              auVar32._16_4_ = uVar139;
              auVar32._20_4_ = uVar139;
              auVar32._24_4_ = uVar139;
              auVar32._28_4_ = uVar139;
              auVar96 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar87._12_4_ + auVar87._12_4_,
                                                           CONCAT48(auVar87._8_4_ + auVar87._8_4_,
                                                                    CONCAT44(auVar87._4_4_ +
                                                                             auVar87._4_4_,
                                                                             auVar87._0_4_ +
                                                                             auVar87._0_4_)))),
                                        auVar32);
              uVar143 = vcmpps_avx512vl(local_3a0,auVar96,6);
              if (((byte)uVar143 & bVar82) != 0) {
                auVar148._0_4_ = auVar92._0_4_ * fVar150;
                auVar148._4_4_ = auVar92._4_4_ * fVar138;
                auVar148._8_4_ = auVar92._8_4_ * fVar141;
                auVar148._12_4_ = auVar92._12_4_ * fVar142;
                auVar148._16_4_ = auVar92._16_4_ * 0.0;
                auVar148._20_4_ = auVar92._20_4_ * 0.0;
                auVar148._24_4_ = auVar92._24_4_ * 0.0;
                auVar148._28_4_ = 0;
                auVar96 = vsubps_avx512vl(auVar94,auVar148);
                auVar119._0_4_ =
                     (uint)(bVar75 & 1) * (int)auVar148._0_4_ |
                     (uint)!(bool)(bVar75 & 1) * auVar96._0_4_;
                bVar78 = (bool)((byte)(uVar76 >> 1) & 1);
                auVar119._4_4_ = (uint)bVar78 * (int)auVar148._4_4_ | (uint)!bVar78 * auVar96._4_4_;
                bVar78 = (bool)((byte)(uVar76 >> 2) & 1);
                auVar119._8_4_ = (uint)bVar78 * (int)auVar148._8_4_ | (uint)!bVar78 * auVar96._8_4_;
                bVar78 = (bool)((byte)(uVar76 >> 3) & 1);
                auVar119._12_4_ =
                     (uint)bVar78 * (int)auVar148._12_4_ | (uint)!bVar78 * auVar96._12_4_;
                bVar78 = (bool)((byte)(uVar76 >> 4) & 1);
                auVar119._16_4_ =
                     (uint)bVar78 * (int)auVar148._16_4_ | (uint)!bVar78 * auVar96._16_4_;
                bVar78 = (bool)((byte)(uVar76 >> 5) & 1);
                auVar119._20_4_ =
                     (uint)bVar78 * (int)auVar148._20_4_ | (uint)!bVar78 * auVar96._20_4_;
                bVar78 = (bool)((byte)(uVar76 >> 6) & 1);
                auVar119._24_4_ =
                     (uint)bVar78 * (int)auVar148._24_4_ | (uint)!bVar78 * auVar96._24_4_;
                auVar119._28_4_ = (uint)!SUB81(uVar76 >> 7,0) * auVar96._28_4_;
                auVar33._8_4_ = 0x40000000;
                auVar33._0_8_ = 0x4000000040000000;
                auVar33._12_4_ = 0x40000000;
                auVar33._16_4_ = 0x40000000;
                auVar33._20_4_ = 0x40000000;
                auVar33._24_4_ = 0x40000000;
                auVar33._28_4_ = 0x40000000;
                local_3c0 = vfmsub132ps_avx512vl(auVar119,auVar94,auVar33);
                local_380 = 0;
                if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar78 = true, pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar150 = 1.0 / auVar180._0_4_;
                    local_320[0] = fVar150 * (local_3e0._0_4_ + 0.0);
                    local_320[1] = fVar150 * (local_3e0._4_4_ + 1.0);
                    local_320[2] = fVar150 * (local_3e0._8_4_ + 2.0);
                    local_320[3] = fVar150 * (local_3e0._12_4_ + 3.0);
                    fStack_310 = fVar150 * (local_3e0._16_4_ + 4.0);
                    fStack_30c = fVar150 * (local_3e0._20_4_ + 5.0);
                    fStack_308 = fVar150 * (local_3e0._24_4_ + 6.0);
                    fStack_304 = local_3e0._28_4_ + 7.0;
                    local_300 = local_3c0;
                    local_2e0 = local_3a0;
                    local_420 = 0;
                    uVar77 = (ulong)((byte)uVar143 & bVar82);
                    for (uVar76 = uVar77; (uVar76 & 1) == 0;
                        uVar76 = uVar76 >> 1 | 0x8000000000000000) {
                      local_420 = local_420 + 1;
                    }
                    local_4a0 = vpbroadcastd_avx512vl();
                    local_4c0 = vpbroadcastd_avx512vl();
                    local_520 = auVar183;
                    local_37c = iVar14;
                    local_370 = auVar25;
                    local_360 = uVar26;
                    uStack_358 = uVar28;
                    local_350 = uVar71;
                    uStack_348 = uVar72;
                    do {
                      auVar147 = auVar196._0_16_;
                      local_480 = (uint)uVar77;
                      uStack_47c = (uint)(uVar77 >> 0x20);
                      fVar150 = local_320[local_420];
                      auVar144._4_4_ = fVar150;
                      auVar144._0_4_ = fVar150;
                      auVar144._8_4_ = fVar150;
                      auVar144._12_4_ = fVar150;
                      local_220._16_4_ = fVar150;
                      local_220._0_16_ = auVar144;
                      local_220._20_4_ = fVar150;
                      local_220._24_4_ = fVar150;
                      local_220._28_4_ = fVar150;
                      local_200 = *(undefined4 *)(local_300 + local_420 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_2e0 + local_420 * 4);
                      local_690.context = context->user;
                      fVar138 = 1.0 - fVar150;
                      auVar12 = vfnmadd231ss_fma(ZEXT416((uint)(fVar150 * (fVar138 + fVar138))),
                                                 ZEXT416((uint)fVar138),ZEXT416((uint)fVar138));
                      auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar144,
                                                ZEXT416(0xc0a00000));
                      auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150 * 3.0)),
                                                ZEXT416((uint)(fVar150 + fVar150)),auVar87);
                      auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar144,
                                                ZEXT416(0x40000000));
                      auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar138 * fVar138 * -3.0)),
                                                ZEXT416((uint)(fVar138 + fVar138)),auVar87);
                      auVar195 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150)),auVar144,
                                                 ZEXT416((uint)(fVar138 * -2.0)));
                      fVar150 = auVar12._0_4_ * 0.5;
                      fVar138 = auVar86._0_4_ * 0.5;
                      fVar141 = auVar87._0_4_ * 0.5;
                      fVar142 = auVar195._0_4_ * 0.5;
                      auVar152._0_4_ = fVar142 * local_5a0;
                      auVar152._4_4_ = fVar142 * fStack_59c;
                      auVar152._8_4_ = fVar142 * fStack_598;
                      auVar152._12_4_ = fVar142 * fStack_594;
                      auVar165._4_4_ = fVar141;
                      auVar165._0_4_ = fVar141;
                      auVar165._8_4_ = fVar141;
                      auVar165._12_4_ = fVar141;
                      auVar87 = vfmadd132ps_fma(auVar165,auVar152,auVar8);
                      auVar153._4_4_ = fVar138;
                      auVar153._0_4_ = fVar138;
                      auVar153._8_4_ = fVar138;
                      auVar153._12_4_ = fVar138;
                      auVar87 = vfmadd132ps_fma(auVar153,auVar87,auVar9);
                      auVar85._4_4_ = fVar150;
                      auVar85._0_4_ = fVar150;
                      auVar85._8_4_ = fVar150;
                      auVar85._12_4_ = fVar150;
                      auVar87 = vfmadd213ps_fma(auVar85,auVar25,auVar87);
                      local_280 = auVar87._0_4_;
                      auVar161._8_4_ = 1;
                      auVar161._0_8_ = 0x100000001;
                      auVar161._12_4_ = 1;
                      auVar161._16_4_ = 1;
                      auVar161._20_4_ = 1;
                      auVar161._24_4_ = 1;
                      auVar161._28_4_ = 1;
                      local_260 = vpermps_avx2(auVar161,ZEXT1632(auVar87));
                      auVar167._8_4_ = 2;
                      auVar167._0_8_ = 0x200000002;
                      auVar167._12_4_ = 2;
                      auVar167._16_4_ = 2;
                      auVar167._20_4_ = 2;
                      auVar167._24_4_ = 2;
                      auVar167._28_4_ = 2;
                      local_240 = vpermps_avx2(auVar167,ZEXT1632(auVar87));
                      uStack_27c = local_280;
                      uStack_278 = local_280;
                      uStack_274 = local_280;
                      uStack_270 = local_280;
                      uStack_26c = local_280;
                      uStack_268 = local_280;
                      uStack_264 = local_280;
                      uStack_1fc = local_200;
                      uStack_1f8 = local_200;
                      uStack_1f4 = local_200;
                      uStack_1f0 = local_200;
                      uStack_1ec = local_200;
                      uStack_1e8 = local_200;
                      uStack_1e4 = local_200;
                      local_1e0 = local_4c0._0_8_;
                      uStack_1d8 = local_4c0._8_8_;
                      uStack_1d0 = local_4c0._16_8_;
                      uStack_1c8 = local_4c0._24_8_;
                      local_1c0 = local_4a0;
                      vpcmpeqd_avx2(local_4a0,local_4a0);
                      local_1a0 = (local_690.context)->instID[0];
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = (local_690.context)->instPrimID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_5c0 = local_2a0;
                      local_690.valid = (int *)local_5c0;
                      local_690.geometryUserPtr = pGVar15->userPtr;
                      local_690.hit = (RTCHitN *)&local_280;
                      local_690.N = 8;
                      local_690.ray = (RTCRayN *)ray;
                      if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar15->occlusionFilterN)(&local_690);
                        auVar185 = ZEXT3264(local_520);
                        auVar199 = ZEXT3264(local_620);
                        auVar200 = ZEXT3264(local_600);
                        auVar197 = ZEXT3264(local_640);
                        auVar190 = ZEXT3264(local_660);
                        auVar191 = ZEXT3264(local_560);
                        auVar194 = ZEXT3264(local_540);
                        auVar193 = ZEXT3264(local_500);
                        auVar192 = ZEXT3264(local_4e0);
                        auVar87 = vxorps_avx512vl(auVar147,auVar147);
                        auVar196 = ZEXT1664(auVar87);
                        uVar178 = local_580._0_4_;
                      }
                      auVar87 = auVar196._0_16_;
                      if (local_5c0 == (undefined1  [32])0x0) {
                        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar198 = ZEXT3264(auVar96);
                        uVar77 = CONCAT44(uStack_47c,local_480);
                      }
                      else {
                        p_Var16 = context->args->filter;
                        if (p_Var16 == (RTCFilterFunctionN)0x0) {
                          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar198 = ZEXT3264(auVar96);
                        }
                        else {
                          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar198 = ZEXT3264(auVar96);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar15->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var16)(&local_690);
                            auVar185 = ZEXT3264(local_520);
                            auVar199 = ZEXT3264(local_620);
                            auVar200 = ZEXT3264(local_600);
                            auVar197 = ZEXT3264(local_640);
                            auVar190 = ZEXT3264(local_660);
                            auVar191 = ZEXT3264(local_560);
                            auVar194 = ZEXT3264(local_540);
                            auVar193 = ZEXT3264(local_500);
                            auVar192 = ZEXT3264(local_4e0);
                            auVar87 = vxorps_avx512vl(auVar87,auVar87);
                            auVar196 = ZEXT1664(auVar87);
                            auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar198 = ZEXT3264(auVar96);
                            uVar178 = local_580._0_4_;
                          }
                        }
                        uVar76 = vptestmd_avx512vl(local_5c0,local_5c0);
                        auVar96 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar78 = (bool)((byte)uVar76 & 1);
                        bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar19 = (bool)((byte)(uVar76 >> 3) & 1);
                        bVar20 = (bool)((byte)(uVar76 >> 4) & 1);
                        bVar21 = (bool)((byte)(uVar76 >> 5) & 1);
                        bVar22 = (bool)((byte)(uVar76 >> 6) & 1);
                        bVar23 = SUB81(uVar76 >> 7,0);
                        *(uint *)(local_690.ray + 0x100) =
                             (uint)bVar78 * auVar96._0_4_ |
                             (uint)!bVar78 * *(int *)(local_690.ray + 0x100);
                        *(uint *)(local_690.ray + 0x104) =
                             (uint)bVar17 * auVar96._4_4_ |
                             (uint)!bVar17 * *(int *)(local_690.ray + 0x104);
                        *(uint *)(local_690.ray + 0x108) =
                             (uint)bVar18 * auVar96._8_4_ |
                             (uint)!bVar18 * *(int *)(local_690.ray + 0x108);
                        *(uint *)(local_690.ray + 0x10c) =
                             (uint)bVar19 * auVar96._12_4_ |
                             (uint)!bVar19 * *(int *)(local_690.ray + 0x10c);
                        *(uint *)(local_690.ray + 0x110) =
                             (uint)bVar20 * auVar96._16_4_ |
                             (uint)!bVar20 * *(int *)(local_690.ray + 0x110);
                        *(uint *)(local_690.ray + 0x114) =
                             (uint)bVar21 * auVar96._20_4_ |
                             (uint)!bVar21 * *(int *)(local_690.ray + 0x114);
                        *(uint *)(local_690.ray + 0x118) =
                             (uint)bVar22 * auVar96._24_4_ |
                             (uint)!bVar22 * *(int *)(local_690.ray + 0x118);
                        *(uint *)(local_690.ray + 0x11c) =
                             (uint)bVar23 * auVar96._28_4_ |
                             (uint)!bVar23 * *(int *)(local_690.ray + 0x11c);
                        uVar77 = CONCAT44(uStack_47c,local_480);
                        if (local_5c0 != (undefined1  [32])0x0) {
                          bVar78 = true;
                          break;
                        }
                      }
                      *(int *)(ray + k * 4 + 0x100) = auVar185._0_4_;
                      uVar76 = local_420 & 0x3f;
                      bVar78 = false;
                      local_420 = 0;
                      uVar77 = uVar77 ^ 1L << uVar76;
                      for (uVar76 = uVar77; (uVar76 & 1) == 0;
                          uVar76 = uVar76 >> 1 | 0x8000000000000000) {
                        local_420 = local_420 + 1;
                      }
                    } while (uVar77 != 0);
                  }
                  goto LAB_01d2a853;
                }
              }
            }
            bVar78 = false;
          }
        }
      }
LAB_01d2a853:
      if (8 < iVar14) {
        local_580 = vpbroadcastd_avx512vl();
        fStack_3fc = local_400;
        fStack_3f8 = local_400;
        fStack_3f4 = local_400;
        fStack_3f0 = local_400;
        fStack_3ec = local_400;
        fStack_3e8 = local_400;
        fStack_3e4 = local_400;
        fStack_418 = 1.0 / (float)local_460._0_4_;
        local_460 = vpbroadcastd_avx512vl();
        local_440 = vpbroadcastd_avx512vl();
        lVar79 = 8;
        local_480 = uVar178;
        uStack_47c = uVar178;
        uStack_478 = uVar178;
        uStack_474 = uVar178;
        uStack_470 = uVar178;
        uStack_46c = uVar178;
        uStack_468 = uVar178;
        uStack_464 = uVar178;
        fStack_414 = fStack_418;
        fStack_410 = fStack_418;
        fStack_40c = fStack_418;
        fStack_408 = fStack_418;
        fStack_404 = fStack_418;
        local_420._0_4_ = fStack_418;
        local_420._4_4_ = fStack_418;
        do {
          auVar96 = vpbroadcastd_avx512vl();
          auVar107 = vpor_avx2(auVar96,_DAT_01fe9900);
          uVar27 = vpcmpd_avx512vl(auVar107,local_580,1);
          auVar96 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar79 * 4 + lVar29);
          auVar93 = *(undefined1 (*) [32])(lVar29 + 0x21b37f0 + lVar79 * 4);
          auVar94 = *(undefined1 (*) [32])(lVar29 + 0x21b3c74 + lVar79 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar29 + 0x21b40f8 + lVar79 * 4);
          local_600 = auVar200._0_32_;
          auVar97 = vmulps_avx512vl(local_600,auVar95);
          local_620 = auVar199._0_32_;
          auVar98 = vmulps_avx512vl(local_620,auVar95);
          auVar53._4_4_ = auVar95._4_4_ * (float)local_100._4_4_;
          auVar53._0_4_ = auVar95._0_4_ * (float)local_100._0_4_;
          auVar53._8_4_ = auVar95._8_4_ * fStack_f8;
          auVar53._12_4_ = auVar95._12_4_ * fStack_f4;
          auVar53._16_4_ = auVar95._16_4_ * fStack_f0;
          auVar53._20_4_ = auVar95._20_4_ * fStack_ec;
          auVar53._24_4_ = auVar95._24_4_ * fStack_e8;
          auVar53._28_4_ = auVar107._28_4_;
          auVar104 = auVar190._0_32_;
          auVar107 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar104);
          local_640 = auVar197._0_32_;
          auVar97 = vfmadd231ps_avx512vl(auVar98,auVar94,local_640);
          auVar98 = vfmadd231ps_avx512vl(auVar53,auVar94,local_e0);
          auVar170 = auVar194._0_32_;
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar93,auVar170);
          auVar105 = auVar191._0_32_;
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,auVar105);
          auVar87 = vfmadd231ps_fma(auVar98,auVar93,local_c0);
          local_4e0 = auVar192._0_32_;
          auVar92 = vfmadd231ps_avx512vl(auVar107,auVar96,local_4e0);
          local_500 = auVar193._0_32_;
          auVar100 = vfmadd231ps_avx512vl(auVar97,auVar96,local_500);
          auVar107 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar79 * 4 + lVar29);
          auVar97 = *(undefined1 (*) [32])(lVar29 + 0x21b5c10 + lVar79 * 4);
          auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar96,local_a0);
          auVar98 = *(undefined1 (*) [32])(lVar29 + 0x21b6094 + lVar79 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar29 + 0x21b6518 + lVar79 * 4);
          auVar108 = vmulps_avx512vl(local_600,auVar106);
          auVar99 = vmulps_avx512vl(local_620,auVar106);
          auVar54._4_4_ = auVar106._4_4_ * (float)local_100._4_4_;
          auVar54._0_4_ = auVar106._0_4_ * (float)local_100._0_4_;
          auVar54._8_4_ = auVar106._8_4_ * fStack_f8;
          auVar54._12_4_ = auVar106._12_4_ * fStack_f4;
          auVar54._16_4_ = auVar106._16_4_ * fStack_f0;
          auVar54._20_4_ = auVar106._20_4_ * fStack_ec;
          auVar54._24_4_ = auVar106._24_4_ * fStack_e8;
          auVar54._28_4_ = uStack_e4;
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar98,auVar104);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar98,local_640);
          auVar101 = vfmadd231ps_avx512vl(auVar54,auVar98,local_e0);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar97,auVar170);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,auVar105);
          auVar86 = vfmadd231ps_fma(auVar101,auVar97,local_c0);
          auVar101 = vfmadd231ps_avx512vl(auVar108,auVar107,local_4e0);
          auVar90 = vfmadd231ps_avx512vl(auVar99,auVar107,local_500);
          auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar107,local_a0);
          auVar91 = vmaxps_avx512vl(ZEXT1632(auVar87),ZEXT1632(auVar86));
          auVar108 = vsubps_avx(auVar101,auVar92);
          auVar99 = vsubps_avx(auVar90,auVar100);
          auVar102 = vmulps_avx512vl(auVar100,auVar108);
          auVar103 = vmulps_avx512vl(auVar92,auVar99);
          auVar102 = vsubps_avx512vl(auVar102,auVar103);
          auVar103 = vmulps_avx512vl(auVar99,auVar99);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar108,auVar108);
          auVar91 = vmulps_avx512vl(auVar91,auVar91);
          auVar91 = vmulps_avx512vl(auVar91,auVar103);
          auVar102 = vmulps_avx512vl(auVar102,auVar102);
          uVar143 = vcmpps_avx512vl(auVar102,auVar91,2);
          bVar82 = (byte)uVar27 & (byte)uVar143;
          if (bVar82 == 0) {
            auVar185 = ZEXT3264(auVar105);
            auVar190 = ZEXT3264(auVar104);
          }
          else {
            auVar106 = vmulps_avx512vl(local_5e0,auVar106);
            auVar98 = vfmadd213ps_avx512vl(auVar98,local_160,auVar106);
            auVar97 = vfmadd213ps_avx512vl(auVar97,local_140,auVar98);
            auVar107 = vfmadd213ps_avx512vl(auVar107,local_120,auVar97);
            auVar95 = vmulps_avx512vl(local_5e0,auVar95);
            auVar94 = vfmadd213ps_avx512vl(auVar94,local_160,auVar95);
            auVar93 = vfmadd213ps_avx512vl(auVar93,local_140,auVar94);
            auVar97 = vfmadd213ps_avx512vl(auVar96,local_120,auVar93);
            auVar96 = *(undefined1 (*) [32])(lVar29 + 0x21b457c + lVar79 * 4);
            auVar93 = *(undefined1 (*) [32])(lVar29 + 0x21b4a00 + lVar79 * 4);
            auVar94 = *(undefined1 (*) [32])(lVar29 + 0x21b4e84 + lVar79 * 4);
            auVar95 = *(undefined1 (*) [32])(lVar29 + 0x21b5308 + lVar79 * 4);
            auVar98 = vmulps_avx512vl(local_600,auVar95);
            auVar106 = vmulps_avx512vl(local_620,auVar95);
            auVar95 = vmulps_avx512vl(local_5e0,auVar95);
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,auVar104);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar94,local_640);
            auVar94 = vfmadd231ps_avx512vl(auVar95,local_160,auVar94);
            auVar95 = vfmadd231ps_avx512vl(auVar98,auVar93,auVar170);
            auVar98 = vfmadd231ps_avx512vl(auVar106,auVar93,auVar105);
            auVar93 = vfmadd231ps_avx512vl(auVar94,local_140,auVar93);
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar96,local_4e0);
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar96,local_500);
            auVar106 = vfmadd231ps_avx512vl(auVar93,local_120,auVar96);
            auVar96 = *(undefined1 (*) [32])(lVar29 + 0x21b699c + lVar79 * 4);
            auVar93 = *(undefined1 (*) [32])(lVar29 + 0x21b72a4 + lVar79 * 4);
            auVar94 = *(undefined1 (*) [32])(lVar29 + 0x21b7728 + lVar79 * 4);
            auVar91 = vmulps_avx512vl(local_600,auVar94);
            auVar102 = vmulps_avx512vl(local_620,auVar94);
            auVar94 = vmulps_avx512vl(local_5e0,auVar94);
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar93,auVar104);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar93,local_640);
            auVar94 = vfmadd231ps_avx512vl(auVar94,local_160,auVar93);
            auVar93 = *(undefined1 (*) [32])(lVar29 + 0x21b6e20 + lVar79 * 4);
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar93,auVar170);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar93,auVar105);
            auVar93 = vfmadd231ps_avx512vl(auVar94,local_140,auVar93);
            auVar94 = vfmadd231ps_avx512vl(auVar91,auVar96,local_4e0);
            auVar91 = vfmadd231ps_avx512vl(auVar102,auVar96,local_500);
            auVar93 = vfmadd231ps_avx512vl(auVar93,local_120,auVar96);
            auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar95,auVar102);
            vandps_avx512vl(auVar98,auVar102);
            auVar96 = vmaxps_avx(auVar102,auVar102);
            vandps_avx512vl(auVar106,auVar102);
            auVar96 = vmaxps_avx(auVar96,auVar102);
            auVar74._4_4_ = fStack_3fc;
            auVar74._0_4_ = local_400;
            auVar74._8_4_ = fStack_3f8;
            auVar74._12_4_ = fStack_3f4;
            auVar74._16_4_ = fStack_3f0;
            auVar74._20_4_ = fStack_3ec;
            auVar74._24_4_ = fStack_3e8;
            auVar74._28_4_ = fStack_3e4;
            uVar76 = vcmpps_avx512vl(auVar96,auVar74,1);
            bVar17 = (bool)((byte)uVar76 & 1);
            auVar120._0_4_ = (float)((uint)bVar17 * auVar108._0_4_ | (uint)!bVar17 * auVar95._0_4_);
            bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar120._4_4_ = (float)((uint)bVar17 * auVar108._4_4_ | (uint)!bVar17 * auVar95._4_4_);
            bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar120._8_4_ = (float)((uint)bVar17 * auVar108._8_4_ | (uint)!bVar17 * auVar95._8_4_);
            bVar17 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar120._12_4_ =
                 (float)((uint)bVar17 * auVar108._12_4_ | (uint)!bVar17 * auVar95._12_4_);
            bVar17 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar120._16_4_ =
                 (float)((uint)bVar17 * auVar108._16_4_ | (uint)!bVar17 * auVar95._16_4_);
            bVar17 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar120._20_4_ =
                 (float)((uint)bVar17 * auVar108._20_4_ | (uint)!bVar17 * auVar95._20_4_);
            bVar17 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar120._24_4_ =
                 (float)((uint)bVar17 * auVar108._24_4_ | (uint)!bVar17 * auVar95._24_4_);
            bVar17 = SUB81(uVar76 >> 7,0);
            auVar120._28_4_ = (uint)bVar17 * auVar108._28_4_ | (uint)!bVar17 * auVar95._28_4_;
            bVar17 = (bool)((byte)uVar76 & 1);
            auVar121._0_4_ = (float)((uint)bVar17 * auVar99._0_4_ | (uint)!bVar17 * auVar98._0_4_);
            bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar121._4_4_ = (float)((uint)bVar17 * auVar99._4_4_ | (uint)!bVar17 * auVar98._4_4_);
            bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar121._8_4_ = (float)((uint)bVar17 * auVar99._8_4_ | (uint)!bVar17 * auVar98._8_4_);
            bVar17 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar121._12_4_ =
                 (float)((uint)bVar17 * auVar99._12_4_ | (uint)!bVar17 * auVar98._12_4_);
            bVar17 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar121._16_4_ =
                 (float)((uint)bVar17 * auVar99._16_4_ | (uint)!bVar17 * auVar98._16_4_);
            bVar17 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar121._20_4_ =
                 (float)((uint)bVar17 * auVar99._20_4_ | (uint)!bVar17 * auVar98._20_4_);
            bVar17 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar121._24_4_ =
                 (float)((uint)bVar17 * auVar99._24_4_ | (uint)!bVar17 * auVar98._24_4_);
            bVar17 = SUB81(uVar76 >> 7,0);
            auVar121._28_4_ = (uint)bVar17 * auVar99._28_4_ | (uint)!bVar17 * auVar98._28_4_;
            vandps_avx512vl(auVar94,auVar102);
            vandps_avx512vl(auVar91,auVar102);
            auVar96 = vmaxps_avx(auVar121,auVar121);
            vandps_avx512vl(auVar93,auVar102);
            auVar96 = vmaxps_avx(auVar96,auVar121);
            uVar76 = vcmpps_avx512vl(auVar96,auVar74,1);
            bVar17 = (bool)((byte)uVar76 & 1);
            auVar122._0_4_ = (uint)bVar17 * auVar108._0_4_ | (uint)!bVar17 * auVar94._0_4_;
            bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar122._4_4_ = (uint)bVar17 * auVar108._4_4_ | (uint)!bVar17 * auVar94._4_4_;
            bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar122._8_4_ = (uint)bVar17 * auVar108._8_4_ | (uint)!bVar17 * auVar94._8_4_;
            bVar17 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar122._12_4_ = (uint)bVar17 * auVar108._12_4_ | (uint)!bVar17 * auVar94._12_4_;
            bVar17 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar122._16_4_ = (uint)bVar17 * auVar108._16_4_ | (uint)!bVar17 * auVar94._16_4_;
            bVar17 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar122._20_4_ = (uint)bVar17 * auVar108._20_4_ | (uint)!bVar17 * auVar94._20_4_;
            bVar17 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar122._24_4_ = (uint)bVar17 * auVar108._24_4_ | (uint)!bVar17 * auVar94._24_4_;
            bVar17 = SUB81(uVar76 >> 7,0);
            auVar122._28_4_ = (uint)bVar17 * auVar108._28_4_ | (uint)!bVar17 * auVar94._28_4_;
            bVar17 = (bool)((byte)uVar76 & 1);
            auVar123._0_4_ = (float)((uint)bVar17 * auVar99._0_4_ | (uint)!bVar17 * auVar91._0_4_);
            bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar123._4_4_ = (float)((uint)bVar17 * auVar99._4_4_ | (uint)!bVar17 * auVar91._4_4_);
            bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar123._8_4_ = (float)((uint)bVar17 * auVar99._8_4_ | (uint)!bVar17 * auVar91._8_4_);
            bVar17 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar123._12_4_ =
                 (float)((uint)bVar17 * auVar99._12_4_ | (uint)!bVar17 * auVar91._12_4_);
            bVar17 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar123._16_4_ =
                 (float)((uint)bVar17 * auVar99._16_4_ | (uint)!bVar17 * auVar91._16_4_);
            bVar17 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar123._20_4_ =
                 (float)((uint)bVar17 * auVar99._20_4_ | (uint)!bVar17 * auVar91._20_4_);
            bVar17 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar123._24_4_ =
                 (float)((uint)bVar17 * auVar99._24_4_ | (uint)!bVar17 * auVar91._24_4_);
            bVar17 = SUB81(uVar76 >> 7,0);
            auVar123._28_4_ = (uint)bVar17 * auVar99._28_4_ | (uint)!bVar17 * auVar91._28_4_;
            auVar177._8_4_ = 0x80000000;
            auVar177._0_8_ = 0x8000000080000000;
            auVar177._12_4_ = 0x80000000;
            auVar177._16_4_ = 0x80000000;
            auVar177._20_4_ = 0x80000000;
            auVar177._24_4_ = 0x80000000;
            auVar177._28_4_ = 0x80000000;
            auVar96 = vxorps_avx512vl(auVar122,auVar177);
            auVar91 = auVar196._0_32_;
            auVar93 = vfmadd213ps_avx512vl(auVar120,auVar120,auVar91);
            auVar8 = vfmadd231ps_fma(auVar93,auVar121,auVar121);
            auVar93 = vrsqrt14ps_avx512vl(ZEXT1632(auVar8));
            auVar189._8_4_ = 0xbf000000;
            auVar189._0_8_ = 0xbf000000bf000000;
            auVar189._12_4_ = 0xbf000000;
            auVar189._16_4_ = 0xbf000000;
            auVar189._20_4_ = 0xbf000000;
            auVar189._24_4_ = 0xbf000000;
            auVar189._28_4_ = 0xbf000000;
            fVar150 = auVar93._0_4_;
            fVar138 = auVar93._4_4_;
            fVar141 = auVar93._8_4_;
            fVar142 = auVar93._12_4_;
            fVar169 = auVar93._16_4_;
            fVar171 = auVar93._20_4_;
            fVar83 = auVar93._24_4_;
            auVar55._4_4_ = fVar138 * fVar138 * fVar138 * auVar8._4_4_ * -0.5;
            auVar55._0_4_ = fVar150 * fVar150 * fVar150 * auVar8._0_4_ * -0.5;
            auVar55._8_4_ = fVar141 * fVar141 * fVar141 * auVar8._8_4_ * -0.5;
            auVar55._12_4_ = fVar142 * fVar142 * fVar142 * auVar8._12_4_ * -0.5;
            auVar55._16_4_ = fVar169 * fVar169 * fVar169 * -0.0;
            auVar55._20_4_ = fVar171 * fVar171 * fVar171 * -0.0;
            auVar55._24_4_ = fVar83 * fVar83 * fVar83 * -0.0;
            auVar55._28_4_ = auVar121._28_4_;
            auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar93 = vfmadd231ps_avx512vl(auVar55,auVar94,auVar93);
            auVar56._4_4_ = auVar121._4_4_ * auVar93._4_4_;
            auVar56._0_4_ = auVar121._0_4_ * auVar93._0_4_;
            auVar56._8_4_ = auVar121._8_4_ * auVar93._8_4_;
            auVar56._12_4_ = auVar121._12_4_ * auVar93._12_4_;
            auVar56._16_4_ = auVar121._16_4_ * auVar93._16_4_;
            auVar56._20_4_ = auVar121._20_4_ * auVar93._20_4_;
            auVar56._24_4_ = auVar121._24_4_ * auVar93._24_4_;
            auVar56._28_4_ = 0;
            auVar57._4_4_ = auVar93._4_4_ * -auVar120._4_4_;
            auVar57._0_4_ = auVar93._0_4_ * -auVar120._0_4_;
            auVar57._8_4_ = auVar93._8_4_ * -auVar120._8_4_;
            auVar57._12_4_ = auVar93._12_4_ * -auVar120._12_4_;
            auVar57._16_4_ = auVar93._16_4_ * -auVar120._16_4_;
            auVar57._20_4_ = auVar93._20_4_ * -auVar120._20_4_;
            auVar57._24_4_ = auVar93._24_4_ * -auVar120._24_4_;
            auVar57._28_4_ = auVar121._28_4_;
            auVar95 = vmulps_avx512vl(auVar93,auVar91);
            auVar93 = vfmadd213ps_avx512vl(auVar122,auVar122,auVar91);
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar123,auVar123);
            auVar98 = vrsqrt14ps_avx512vl(auVar93);
            auVar93 = vmulps_avx512vl(auVar93,auVar189);
            fVar150 = auVar98._0_4_;
            fVar138 = auVar98._4_4_;
            fVar141 = auVar98._8_4_;
            fVar142 = auVar98._12_4_;
            fVar169 = auVar98._16_4_;
            fVar171 = auVar98._20_4_;
            fVar83 = auVar98._24_4_;
            auVar58._4_4_ = fVar138 * fVar138 * fVar138 * auVar93._4_4_;
            auVar58._0_4_ = fVar150 * fVar150 * fVar150 * auVar93._0_4_;
            auVar58._8_4_ = fVar141 * fVar141 * fVar141 * auVar93._8_4_;
            auVar58._12_4_ = fVar142 * fVar142 * fVar142 * auVar93._12_4_;
            auVar58._16_4_ = fVar169 * fVar169 * fVar169 * auVar93._16_4_;
            auVar58._20_4_ = fVar171 * fVar171 * fVar171 * auVar93._20_4_;
            auVar58._24_4_ = fVar83 * fVar83 * fVar83 * auVar93._24_4_;
            auVar58._28_4_ = auVar93._28_4_;
            auVar93 = vfmadd231ps_avx512vl(auVar58,auVar94,auVar98);
            auVar59._4_4_ = auVar123._4_4_ * auVar93._4_4_;
            auVar59._0_4_ = auVar123._0_4_ * auVar93._0_4_;
            auVar59._8_4_ = auVar123._8_4_ * auVar93._8_4_;
            auVar59._12_4_ = auVar123._12_4_ * auVar93._12_4_;
            auVar59._16_4_ = auVar123._16_4_ * auVar93._16_4_;
            auVar59._20_4_ = auVar123._20_4_ * auVar93._20_4_;
            auVar59._24_4_ = auVar123._24_4_ * auVar93._24_4_;
            auVar59._28_4_ = auVar98._28_4_;
            auVar60._4_4_ = auVar93._4_4_ * auVar96._4_4_;
            auVar60._0_4_ = auVar93._0_4_ * auVar96._0_4_;
            auVar60._8_4_ = auVar93._8_4_ * auVar96._8_4_;
            auVar60._12_4_ = auVar93._12_4_ * auVar96._12_4_;
            auVar60._16_4_ = auVar93._16_4_ * auVar96._16_4_;
            auVar60._20_4_ = auVar93._20_4_ * auVar96._20_4_;
            auVar60._24_4_ = auVar93._24_4_ * auVar96._24_4_;
            auVar60._28_4_ = auVar96._28_4_;
            auVar96 = vmulps_avx512vl(auVar93,auVar91);
            auVar8 = vfmadd213ps_fma(auVar56,ZEXT1632(auVar87),auVar92);
            auVar93 = ZEXT1632(auVar87);
            auVar9 = vfmadd213ps_fma(auVar57,auVar93,auVar100);
            auVar94 = vfmadd213ps_avx512vl(auVar95,auVar93,auVar97);
            auVar98 = vfmadd213ps_avx512vl(auVar59,ZEXT1632(auVar86),auVar101);
            auVar175 = vfnmadd213ps_fma(auVar56,auVar93,auVar92);
            auVar106 = ZEXT1632(auVar86);
            auVar195 = vfmadd213ps_fma(auVar60,auVar106,auVar90);
            auVar151 = vfnmadd213ps_fma(auVar57,auVar93,auVar100);
            auVar12 = vfmadd213ps_fma(auVar96,auVar106,auVar107);
            auVar100 = ZEXT1632(auVar87);
            auVar172 = vfnmadd231ps_fma(auVar97,auVar100,auVar95);
            auVar31 = vfnmadd213ps_fma(auVar59,auVar106,auVar101);
            auVar88 = vfnmadd213ps_fma(auVar60,auVar106,auVar90);
            auVar176 = vfnmadd231ps_fma(auVar107,ZEXT1632(auVar86),auVar96);
            auVar107 = vsubps_avx512vl(auVar98,ZEXT1632(auVar175));
            auVar96 = vsubps_avx(ZEXT1632(auVar195),ZEXT1632(auVar151));
            auVar93 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar172));
            auVar61._4_4_ = auVar96._4_4_ * auVar172._4_4_;
            auVar61._0_4_ = auVar96._0_4_ * auVar172._0_4_;
            auVar61._8_4_ = auVar96._8_4_ * auVar172._8_4_;
            auVar61._12_4_ = auVar96._12_4_ * auVar172._12_4_;
            auVar61._16_4_ = auVar96._16_4_ * 0.0;
            auVar61._20_4_ = auVar96._20_4_ * 0.0;
            auVar61._24_4_ = auVar96._24_4_ * 0.0;
            auVar61._28_4_ = auVar95._28_4_;
            auVar87 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar151),auVar93);
            auVar62._4_4_ = auVar93._4_4_ * auVar175._4_4_;
            auVar62._0_4_ = auVar93._0_4_ * auVar175._0_4_;
            auVar62._8_4_ = auVar93._8_4_ * auVar175._8_4_;
            auVar62._12_4_ = auVar93._12_4_ * auVar175._12_4_;
            auVar62._16_4_ = auVar93._16_4_ * 0.0;
            auVar62._20_4_ = auVar93._20_4_ * 0.0;
            auVar62._24_4_ = auVar93._24_4_ * 0.0;
            auVar62._28_4_ = auVar93._28_4_;
            auVar85 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar172),auVar107);
            auVar63._4_4_ = auVar151._4_4_ * auVar107._4_4_;
            auVar63._0_4_ = auVar151._0_4_ * auVar107._0_4_;
            auVar63._8_4_ = auVar151._8_4_ * auVar107._8_4_;
            auVar63._12_4_ = auVar151._12_4_ * auVar107._12_4_;
            auVar63._16_4_ = auVar107._16_4_ * 0.0;
            auVar63._20_4_ = auVar107._20_4_ * 0.0;
            auVar63._24_4_ = auVar107._24_4_ * 0.0;
            auVar63._28_4_ = auVar107._28_4_;
            auVar147 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar175),auVar96);
            auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar147),auVar91,ZEXT1632(auVar85));
            auVar96 = vfmadd231ps_avx512vl(auVar96,auVar91,ZEXT1632(auVar87));
            uVar76 = vcmpps_avx512vl(auVar96,auVar91,2);
            bVar75 = (byte)uVar76;
            fVar130 = (float)((uint)(bVar75 & 1) * auVar8._0_4_ |
                             (uint)!(bool)(bVar75 & 1) * auVar31._0_4_);
            bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
            fVar132 = (float)((uint)bVar17 * auVar8._4_4_ | (uint)!bVar17 * auVar31._4_4_);
            bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
            fVar135 = (float)((uint)bVar17 * auVar8._8_4_ | (uint)!bVar17 * auVar31._8_4_);
            bVar17 = (bool)((byte)(uVar76 >> 3) & 1);
            fVar136 = (float)((uint)bVar17 * auVar8._12_4_ | (uint)!bVar17 * auVar31._12_4_);
            auVar106 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar135,CONCAT44(fVar132,fVar130))));
            fVar131 = (float)((uint)(bVar75 & 1) * auVar9._0_4_ |
                             (uint)!(bool)(bVar75 & 1) * auVar88._0_4_);
            bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
            fVar134 = (float)((uint)bVar17 * auVar9._4_4_ | (uint)!bVar17 * auVar88._4_4_);
            bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
            fVar133 = (float)((uint)bVar17 * auVar9._8_4_ | (uint)!bVar17 * auVar88._8_4_);
            bVar17 = (bool)((byte)(uVar76 >> 3) & 1);
            fVar137 = (float)((uint)bVar17 * auVar9._12_4_ | (uint)!bVar17 * auVar88._12_4_);
            auVar108 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar133,CONCAT44(fVar134,fVar131))));
            auVar124._0_4_ =
                 (float)((uint)(bVar75 & 1) * auVar94._0_4_ |
                        (uint)!(bool)(bVar75 & 1) * auVar176._0_4_);
            bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar124._4_4_ = (float)((uint)bVar17 * auVar94._4_4_ | (uint)!bVar17 * auVar176._4_4_);
            bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar124._8_4_ = (float)((uint)bVar17 * auVar94._8_4_ | (uint)!bVar17 * auVar176._8_4_);
            bVar17 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar124._12_4_ =
                 (float)((uint)bVar17 * auVar94._12_4_ | (uint)!bVar17 * auVar176._12_4_);
            fVar141 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar94._16_4_);
            auVar124._16_4_ = fVar141;
            fVar138 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar94._20_4_);
            auVar124._20_4_ = fVar138;
            fVar150 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar94._24_4_);
            auVar124._24_4_ = fVar150;
            iVar1 = (uint)(byte)(uVar76 >> 7) * auVar94._28_4_;
            auVar124._28_4_ = iVar1;
            auVar96 = vblendmps_avx512vl(ZEXT1632(auVar175),auVar98);
            auVar125._0_4_ =
                 (uint)(bVar75 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar87._0_4_;
            bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar125._4_4_ = (uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar87._4_4_;
            bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar125._8_4_ = (uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar87._8_4_;
            bVar17 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar125._12_4_ = (uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar87._12_4_;
            auVar125._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * auVar96._16_4_;
            auVar125._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * auVar96._20_4_;
            auVar125._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * auVar96._24_4_;
            auVar125._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar96._28_4_;
            auVar96 = vblendmps_avx512vl(ZEXT1632(auVar151),ZEXT1632(auVar195));
            auVar126._0_4_ =
                 (float)((uint)(bVar75 & 1) * auVar96._0_4_ |
                        (uint)!(bool)(bVar75 & 1) * auVar8._0_4_);
            bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar126._4_4_ = (float)((uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar8._4_4_);
            bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar126._8_4_ = (float)((uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar8._8_4_);
            bVar17 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar126._12_4_ = (float)((uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar8._12_4_)
            ;
            fVar171 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar96._16_4_);
            auVar126._16_4_ = fVar171;
            fVar142 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar96._20_4_);
            auVar126._20_4_ = fVar142;
            fVar169 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar96._24_4_);
            auVar126._24_4_ = fVar169;
            auVar126._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar96._28_4_;
            auVar96 = vblendmps_avx512vl(ZEXT1632(auVar172),ZEXT1632(auVar12));
            auVar127._0_4_ =
                 (float)((uint)(bVar75 & 1) * auVar96._0_4_ |
                        (uint)!(bool)(bVar75 & 1) * auVar9._0_4_);
            bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar127._4_4_ = (float)((uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar9._4_4_);
            bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar127._8_4_ = (float)((uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar9._8_4_);
            bVar17 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar127._12_4_ = (float)((uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar9._12_4_)
            ;
            fVar149 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar96._16_4_);
            auVar127._16_4_ = fVar149;
            fVar84 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar96._20_4_);
            auVar127._20_4_ = fVar84;
            fVar83 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar96._24_4_);
            auVar127._24_4_ = fVar83;
            iVar2 = (uint)(byte)(uVar76 >> 7) * auVar96._28_4_;
            auVar127._28_4_ = iVar2;
            auVar128._0_4_ =
                 (uint)(bVar75 & 1) * (int)auVar175._0_4_ |
                 (uint)!(bool)(bVar75 & 1) * auVar98._0_4_;
            bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar128._4_4_ = (uint)bVar17 * (int)auVar175._4_4_ | (uint)!bVar17 * auVar98._4_4_;
            bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar128._8_4_ = (uint)bVar17 * (int)auVar175._8_4_ | (uint)!bVar17 * auVar98._8_4_;
            bVar17 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar128._12_4_ = (uint)bVar17 * (int)auVar175._12_4_ | (uint)!bVar17 * auVar98._12_4_;
            auVar128._16_4_ = (uint)!(bool)((byte)(uVar76 >> 4) & 1) * auVar98._16_4_;
            auVar128._20_4_ = (uint)!(bool)((byte)(uVar76 >> 5) & 1) * auVar98._20_4_;
            auVar128._24_4_ = (uint)!(bool)((byte)(uVar76 >> 6) & 1) * auVar98._24_4_;
            auVar128._28_4_ = (uint)!SUB81(uVar76 >> 7,0) * auVar98._28_4_;
            bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar76 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
            bVar18 = (bool)((byte)(uVar76 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar76 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar98 = vsubps_avx512vl(auVar128,auVar106);
            auVar93 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar151._12_4_ |
                                                    (uint)!bVar21 * auVar195._12_4_,
                                                    CONCAT48((uint)bVar19 * (int)auVar151._8_4_ |
                                                             (uint)!bVar19 * auVar195._8_4_,
                                                             CONCAT44((uint)bVar17 *
                                                                      (int)auVar151._4_4_ |
                                                                      (uint)!bVar17 * auVar195._4_4_
                                                                      ,(uint)(bVar75 & 1) *
                                                                       (int)auVar151._0_4_ |
                                                                       (uint)!(bool)(bVar75 & 1) *
                                                                       auVar195._0_4_)))),auVar108);
            auVar94 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar172._12_4_ |
                                                    (uint)!bVar22 * auVar12._12_4_,
                                                    CONCAT48((uint)bVar20 * (int)auVar172._8_4_ |
                                                             (uint)!bVar20 * auVar12._8_4_,
                                                             CONCAT44((uint)bVar18 *
                                                                      (int)auVar172._4_4_ |
                                                                      (uint)!bVar18 * auVar12._4_4_,
                                                                      (uint)(bVar75 & 1) *
                                                                      (int)auVar172._0_4_ |
                                                                      (uint)!(bool)(bVar75 & 1) *
                                                                      auVar12._0_4_)))),auVar124);
            auVar95 = vsubps_avx(auVar106,auVar125);
            auVar107 = vsubps_avx(auVar108,auVar126);
            auVar97 = vsubps_avx(auVar124,auVar127);
            auVar64._4_4_ = auVar94._4_4_ * fVar132;
            auVar64._0_4_ = auVar94._0_4_ * fVar130;
            auVar64._8_4_ = auVar94._8_4_ * fVar135;
            auVar64._12_4_ = auVar94._12_4_ * fVar136;
            auVar64._16_4_ = auVar94._16_4_ * 0.0;
            auVar64._20_4_ = auVar94._20_4_ * 0.0;
            auVar64._24_4_ = auVar94._24_4_ * 0.0;
            auVar64._28_4_ = 0;
            auVar87 = vfmsub231ps_fma(auVar64,auVar124,auVar98);
            auVar157._0_4_ = fVar131 * auVar98._0_4_;
            auVar157._4_4_ = fVar134 * auVar98._4_4_;
            auVar157._8_4_ = fVar133 * auVar98._8_4_;
            auVar157._12_4_ = fVar137 * auVar98._12_4_;
            auVar157._16_4_ = auVar98._16_4_ * 0.0;
            auVar157._20_4_ = auVar98._20_4_ * 0.0;
            auVar157._24_4_ = auVar98._24_4_ * 0.0;
            auVar157._28_4_ = 0;
            auVar8 = vfmsub231ps_fma(auVar157,auVar106,auVar93);
            auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar91,ZEXT1632(auVar87));
            auVar162._0_4_ = auVar93._0_4_ * auVar124._0_4_;
            auVar162._4_4_ = auVar93._4_4_ * auVar124._4_4_;
            auVar162._8_4_ = auVar93._8_4_ * auVar124._8_4_;
            auVar162._12_4_ = auVar93._12_4_ * auVar124._12_4_;
            auVar162._16_4_ = auVar93._16_4_ * fVar141;
            auVar162._20_4_ = auVar93._20_4_ * fVar138;
            auVar162._24_4_ = auVar93._24_4_ * fVar150;
            auVar162._28_4_ = 0;
            auVar87 = vfmsub231ps_fma(auVar162,auVar108,auVar94);
            auVar99 = vfmadd231ps_avx512vl(auVar96,auVar91,ZEXT1632(auVar87));
            auVar96 = vmulps_avx512vl(auVar97,auVar125);
            auVar96 = vfmsub231ps_avx512vl(auVar96,auVar95,auVar127);
            auVar65._4_4_ = auVar107._4_4_ * auVar127._4_4_;
            auVar65._0_4_ = auVar107._0_4_ * auVar127._0_4_;
            auVar65._8_4_ = auVar107._8_4_ * auVar127._8_4_;
            auVar65._12_4_ = auVar107._12_4_ * auVar127._12_4_;
            auVar65._16_4_ = auVar107._16_4_ * fVar149;
            auVar65._20_4_ = auVar107._20_4_ * fVar84;
            auVar65._24_4_ = auVar107._24_4_ * fVar83;
            auVar65._28_4_ = iVar2;
            auVar87 = vfmsub231ps_fma(auVar65,auVar126,auVar97);
            auVar163._0_4_ = auVar126._0_4_ * auVar95._0_4_;
            auVar163._4_4_ = auVar126._4_4_ * auVar95._4_4_;
            auVar163._8_4_ = auVar126._8_4_ * auVar95._8_4_;
            auVar163._12_4_ = auVar126._12_4_ * auVar95._12_4_;
            auVar163._16_4_ = fVar171 * auVar95._16_4_;
            auVar163._20_4_ = fVar142 * auVar95._20_4_;
            auVar163._24_4_ = fVar169 * auVar95._24_4_;
            auVar163._28_4_ = 0;
            auVar8 = vfmsub231ps_fma(auVar163,auVar107,auVar125);
            auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar91,auVar96);
            auVar92 = vfmadd231ps_avx512vl(auVar96,auVar91,ZEXT1632(auVar87));
            auVar96 = vmaxps_avx(auVar99,auVar92);
            uVar143 = vcmpps_avx512vl(auVar96,auVar91,2);
            bVar82 = bVar82 & (byte)uVar143;
            auVar185 = ZEXT3264(auVar105);
            if (bVar82 != 0) {
              uVar139 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar184._4_4_ = uVar139;
              auVar184._0_4_ = uVar139;
              auVar184._8_4_ = uVar139;
              auVar184._12_4_ = uVar139;
              auVar184._16_4_ = uVar139;
              auVar184._20_4_ = uVar139;
              auVar184._24_4_ = uVar139;
              auVar184._28_4_ = uVar139;
              auVar186 = ZEXT3264(auVar184);
              auVar66._4_4_ = auVar97._4_4_ * auVar93._4_4_;
              auVar66._0_4_ = auVar97._0_4_ * auVar93._0_4_;
              auVar66._8_4_ = auVar97._8_4_ * auVar93._8_4_;
              auVar66._12_4_ = auVar97._12_4_ * auVar93._12_4_;
              auVar66._16_4_ = auVar97._16_4_ * auVar93._16_4_;
              auVar66._20_4_ = auVar97._20_4_ * auVar93._20_4_;
              auVar66._24_4_ = auVar97._24_4_ * auVar93._24_4_;
              auVar66._28_4_ = auVar96._28_4_;
              auVar9 = vfmsub231ps_fma(auVar66,auVar107,auVar94);
              auVar67._4_4_ = auVar94._4_4_ * auVar95._4_4_;
              auVar67._0_4_ = auVar94._0_4_ * auVar95._0_4_;
              auVar67._8_4_ = auVar94._8_4_ * auVar95._8_4_;
              auVar67._12_4_ = auVar94._12_4_ * auVar95._12_4_;
              auVar67._16_4_ = auVar94._16_4_ * auVar95._16_4_;
              auVar67._20_4_ = auVar94._20_4_ * auVar95._20_4_;
              auVar67._24_4_ = auVar94._24_4_ * auVar95._24_4_;
              auVar67._28_4_ = auVar94._28_4_;
              auVar8 = vfmsub231ps_fma(auVar67,auVar98,auVar97);
              auVar68._4_4_ = auVar107._4_4_ * auVar98._4_4_;
              auVar68._0_4_ = auVar107._0_4_ * auVar98._0_4_;
              auVar68._8_4_ = auVar107._8_4_ * auVar98._8_4_;
              auVar68._12_4_ = auVar107._12_4_ * auVar98._12_4_;
              auVar68._16_4_ = auVar107._16_4_ * auVar98._16_4_;
              auVar68._20_4_ = auVar107._20_4_ * auVar98._20_4_;
              auVar68._24_4_ = auVar107._24_4_ * auVar98._24_4_;
              auVar68._28_4_ = auVar107._28_4_;
              auVar195 = vfmsub231ps_fma(auVar68,auVar95,auVar93);
              auVar87 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar8),ZEXT1632(auVar195));
              auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),ZEXT1632(auVar9),auVar91);
              auVar93 = vrcp14ps_avx512vl(auVar96);
              auVar95 = auVar198._0_32_;
              auVar94 = vfnmadd213ps_avx512vl(auVar93,auVar96,auVar95);
              auVar87 = vfmadd132ps_fma(auVar94,auVar93,auVar93);
              auVar69._4_4_ = auVar195._4_4_ * auVar124._4_4_;
              auVar69._0_4_ = auVar195._0_4_ * auVar124._0_4_;
              auVar69._8_4_ = auVar195._8_4_ * auVar124._8_4_;
              auVar69._12_4_ = auVar195._12_4_ * auVar124._12_4_;
              auVar69._16_4_ = fVar141 * 0.0;
              auVar69._20_4_ = fVar138 * 0.0;
              auVar69._24_4_ = fVar150 * 0.0;
              auVar69._28_4_ = iVar1;
              auVar8 = vfmadd231ps_fma(auVar69,auVar108,ZEXT1632(auVar8));
              auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar106,ZEXT1632(auVar9));
              fVar150 = auVar87._0_4_;
              fVar138 = auVar87._4_4_;
              fVar141 = auVar87._8_4_;
              fVar142 = auVar87._12_4_;
              local_3a0 = ZEXT1632(CONCAT412(auVar8._12_4_ * fVar142,
                                             CONCAT48(auVar8._8_4_ * fVar141,
                                                      CONCAT44(auVar8._4_4_ * fVar138,
                                                               auVar8._0_4_ * fVar150))));
              uVar143 = vcmpps_avx512vl(local_3a0,auVar184,2);
              auVar73._4_4_ = uStack_47c;
              auVar73._0_4_ = local_480;
              auVar73._8_4_ = uStack_478;
              auVar73._12_4_ = uStack_474;
              auVar73._16_4_ = uStack_470;
              auVar73._20_4_ = uStack_46c;
              auVar73._24_4_ = uStack_468;
              auVar73._28_4_ = uStack_464;
              uVar27 = vcmpps_avx512vl(local_3a0,auVar73,0xd);
              bVar82 = (byte)uVar143 & (byte)uVar27 & bVar82;
              if (bVar82 != 0) {
                uVar143 = vcmpps_avx512vl(auVar96,auVar91,4);
                bVar82 = bVar82 & (byte)uVar143;
                auVar190 = ZEXT3264(local_660);
                if (bVar82 != 0) {
                  fVar169 = auVar99._0_4_ * fVar150;
                  fVar171 = auVar99._4_4_ * fVar138;
                  auVar70._4_4_ = fVar171;
                  auVar70._0_4_ = fVar169;
                  fVar83 = auVar99._8_4_ * fVar141;
                  auVar70._8_4_ = fVar83;
                  fVar84 = auVar99._12_4_ * fVar142;
                  auVar70._12_4_ = fVar84;
                  fVar149 = auVar99._16_4_ * 0.0;
                  auVar70._16_4_ = fVar149;
                  fVar130 = auVar99._20_4_ * 0.0;
                  auVar70._20_4_ = fVar130;
                  fVar131 = auVar99._24_4_ * 0.0;
                  auVar70._24_4_ = fVar131;
                  auVar70._28_4_ = auVar96._28_4_;
                  auVar93 = vsubps_avx512vl(auVar95,auVar70);
                  local_3e0._0_4_ =
                       (float)((uint)(bVar75 & 1) * (int)fVar169 |
                              (uint)!(bool)(bVar75 & 1) * auVar93._0_4_);
                  bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
                  local_3e0._4_4_ =
                       (float)((uint)bVar17 * (int)fVar171 | (uint)!bVar17 * auVar93._4_4_);
                  bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
                  local_3e0._8_4_ =
                       (float)((uint)bVar17 * (int)fVar83 | (uint)!bVar17 * auVar93._8_4_);
                  bVar17 = (bool)((byte)(uVar76 >> 3) & 1);
                  local_3e0._12_4_ =
                       (float)((uint)bVar17 * (int)fVar84 | (uint)!bVar17 * auVar93._12_4_);
                  bVar17 = (bool)((byte)(uVar76 >> 4) & 1);
                  local_3e0._16_4_ =
                       (float)((uint)bVar17 * (int)fVar149 | (uint)!bVar17 * auVar93._16_4_);
                  bVar17 = (bool)((byte)(uVar76 >> 5) & 1);
                  local_3e0._20_4_ =
                       (float)((uint)bVar17 * (int)fVar130 | (uint)!bVar17 * auVar93._20_4_);
                  bVar17 = (bool)((byte)(uVar76 >> 6) & 1);
                  local_3e0._24_4_ =
                       (float)((uint)bVar17 * (int)fVar131 | (uint)!bVar17 * auVar93._24_4_);
                  bVar17 = SUB81(uVar76 >> 7,0);
                  local_3e0._28_4_ =
                       (float)((uint)bVar17 * auVar96._28_4_ | (uint)!bVar17 * auVar93._28_4_);
                  auVar96 = vsubps_avx(ZEXT1632(auVar86),auVar100);
                  auVar87 = vfmadd213ps_fma(auVar96,local_3e0,auVar100);
                  uVar139 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                  auVar35._4_4_ = uVar139;
                  auVar35._0_4_ = uVar139;
                  auVar35._8_4_ = uVar139;
                  auVar35._12_4_ = uVar139;
                  auVar35._16_4_ = uVar139;
                  auVar35._20_4_ = uVar139;
                  auVar35._24_4_ = uVar139;
                  auVar35._28_4_ = uVar139;
                  auVar96 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar87._12_4_ + auVar87._12_4_,
                                                               CONCAT48(auVar87._8_4_ +
                                                                        auVar87._8_4_,
                                                                        CONCAT44(auVar87._4_4_ +
                                                                                 auVar87._4_4_,
                                                                                 auVar87._0_4_ +
                                                                                 auVar87._0_4_)))),
                                            auVar35);
                  uVar143 = vcmpps_avx512vl(local_3a0,auVar96,6);
                  if (((byte)uVar143 & bVar82) != 0) {
                    auVar146._0_4_ = auVar92._0_4_ * fVar150;
                    auVar146._4_4_ = auVar92._4_4_ * fVar138;
                    auVar146._8_4_ = auVar92._8_4_ * fVar141;
                    auVar146._12_4_ = auVar92._12_4_ * fVar142;
                    auVar146._16_4_ = auVar92._16_4_ * 0.0;
                    auVar146._20_4_ = auVar92._20_4_ * 0.0;
                    auVar146._24_4_ = auVar92._24_4_ * 0.0;
                    auVar146._28_4_ = 0;
                    auVar96 = vsubps_avx512vl(auVar95,auVar146);
                    auVar129._0_4_ =
                         (uint)(bVar75 & 1) * (int)auVar146._0_4_ |
                         (uint)!(bool)(bVar75 & 1) * auVar96._0_4_;
                    bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
                    auVar129._4_4_ =
                         (uint)bVar17 * (int)auVar146._4_4_ | (uint)!bVar17 * auVar96._4_4_;
                    bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
                    auVar129._8_4_ =
                         (uint)bVar17 * (int)auVar146._8_4_ | (uint)!bVar17 * auVar96._8_4_;
                    bVar17 = (bool)((byte)(uVar76 >> 3) & 1);
                    auVar129._12_4_ =
                         (uint)bVar17 * (int)auVar146._12_4_ | (uint)!bVar17 * auVar96._12_4_;
                    bVar17 = (bool)((byte)(uVar76 >> 4) & 1);
                    auVar129._16_4_ =
                         (uint)bVar17 * (int)auVar146._16_4_ | (uint)!bVar17 * auVar96._16_4_;
                    bVar17 = (bool)((byte)(uVar76 >> 5) & 1);
                    auVar129._20_4_ =
                         (uint)bVar17 * (int)auVar146._20_4_ | (uint)!bVar17 * auVar96._20_4_;
                    bVar17 = (bool)((byte)(uVar76 >> 6) & 1);
                    auVar129._24_4_ =
                         (uint)bVar17 * (int)auVar146._24_4_ | (uint)!bVar17 * auVar96._24_4_;
                    auVar129._28_4_ = (uint)!SUB81(uVar76 >> 7,0) * auVar96._28_4_;
                    auVar36._8_4_ = 0x40000000;
                    auVar36._0_8_ = 0x4000000040000000;
                    auVar36._12_4_ = 0x40000000;
                    auVar36._16_4_ = 0x40000000;
                    auVar36._20_4_ = 0x40000000;
                    auVar36._24_4_ = 0x40000000;
                    auVar36._28_4_ = 0x40000000;
                    local_3c0 = vfmsub132ps_avx512vl(auVar129,auVar95,auVar36);
                    local_380 = (undefined4)lVar79;
                    pGVar15 = (context->scene->geometries).items[uVar80].ptr;
                    if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                      bVar75 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar75 = 1, pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar87 = vcvtsi2ss_avx512f(auVar191._0_16_,local_380);
                      fVar150 = auVar87._0_4_;
                      local_320[0] = (fVar150 + local_3e0._0_4_ + 0.0) * (float)local_420;
                      local_320[1] = (fVar150 + local_3e0._4_4_ + 1.0) * local_420._4_4_;
                      local_320[2] = (fVar150 + local_3e0._8_4_ + 2.0) * fStack_418;
                      local_320[3] = (fVar150 + local_3e0._12_4_ + 3.0) * fStack_414;
                      fStack_310 = (fVar150 + local_3e0._16_4_ + 4.0) * fStack_410;
                      fStack_30c = (fVar150 + local_3e0._20_4_ + 5.0) * fStack_40c;
                      fStack_308 = (fVar150 + local_3e0._24_4_ + 6.0) * fStack_408;
                      fStack_304 = fVar150 + local_3e0._28_4_ + 7.0;
                      local_300 = local_3c0;
                      local_2e0 = local_3a0;
                      uVar76 = CONCAT71(0,(byte)uVar143 & bVar82);
                      local_520._0_8_ = uVar76;
                      lVar30 = 0;
                      for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
                        lVar30 = lVar30 + 1;
                      }
                      local_4a0._0_8_ = lVar30;
                      local_2c0 = auVar184;
                      local_4c0._0_8_ = pGVar15;
                      local_37c = iVar14;
                      local_370 = auVar25;
                      local_360 = uVar26;
                      uStack_358 = uVar28;
                      local_350 = uVar71;
                      uStack_348 = uVar72;
                      do {
                        auVar195 = auVar196._0_16_;
                        fVar150 = local_320[local_4a0._0_8_];
                        auVar145._4_4_ = fVar150;
                        auVar145._0_4_ = fVar150;
                        auVar145._8_4_ = fVar150;
                        auVar145._12_4_ = fVar150;
                        local_220._16_4_ = fVar150;
                        local_220._0_16_ = auVar145;
                        local_220._20_4_ = fVar150;
                        local_220._24_4_ = fVar150;
                        local_220._28_4_ = fVar150;
                        local_200 = *(undefined4 *)(local_300 + local_4a0._0_8_ * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_2e0 + local_4a0._0_8_ * 4);
                        local_690.context = context->user;
                        fVar138 = 1.0 - fVar150;
                        auVar9 = vfnmadd231ss_fma(ZEXT416((uint)(fVar150 * (fVar138 + fVar138))),
                                                  ZEXT416((uint)fVar138),ZEXT416((uint)fVar138));
                        auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar145,
                                                  ZEXT416(0xc0a00000));
                        auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150 * 3.0)),
                                                  ZEXT416((uint)(fVar150 + fVar150)),auVar87);
                        auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar145,
                                                  ZEXT416(0x40000000));
                        auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar138 * fVar138 * -3.0)),
                                                  ZEXT416((uint)(fVar138 + fVar138)),auVar87);
                        auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150)),auVar145,
                                                 ZEXT416((uint)(fVar138 * -2.0)));
                        fVar150 = auVar9._0_4_ * 0.5;
                        fVar138 = auVar86._0_4_ * 0.5;
                        fVar141 = auVar87._0_4_ * 0.5;
                        fVar142 = auVar8._0_4_ * 0.5;
                        auVar154._0_4_ = fVar142 * local_5a0;
                        auVar154._4_4_ = fVar142 * fStack_59c;
                        auVar154._8_4_ = fVar142 * fStack_598;
                        auVar154._12_4_ = fVar142 * fStack_594;
                        auVar166._4_4_ = fVar141;
                        auVar166._0_4_ = fVar141;
                        auVar166._8_4_ = fVar141;
                        auVar166._12_4_ = fVar141;
                        auVar87 = vfmadd132ps_fma(auVar166,auVar154,auVar10);
                        auVar155._4_4_ = fVar138;
                        auVar155._0_4_ = fVar138;
                        auVar155._8_4_ = fVar138;
                        auVar155._12_4_ = fVar138;
                        auVar87 = vfmadd132ps_fma(auVar155,auVar87,auVar11);
                        auVar140._4_4_ = fVar150;
                        auVar140._0_4_ = fVar150;
                        auVar140._8_4_ = fVar150;
                        auVar140._12_4_ = fVar150;
                        auVar87 = vfmadd213ps_fma(auVar140,auVar25,auVar87);
                        local_280 = auVar87._0_4_;
                        auVar164._8_4_ = 1;
                        auVar164._0_8_ = 0x100000001;
                        auVar164._12_4_ = 1;
                        auVar164._16_4_ = 1;
                        auVar164._20_4_ = 1;
                        auVar164._24_4_ = 1;
                        auVar164._28_4_ = 1;
                        local_260 = vpermps_avx2(auVar164,ZEXT1632(auVar87));
                        auVar168._8_4_ = 2;
                        auVar168._0_8_ = 0x200000002;
                        auVar168._12_4_ = 2;
                        auVar168._16_4_ = 2;
                        auVar168._20_4_ = 2;
                        auVar168._24_4_ = 2;
                        auVar168._28_4_ = 2;
                        local_240 = vpermps_avx2(auVar168,ZEXT1632(auVar87));
                        uStack_27c = local_280;
                        uStack_278 = local_280;
                        uStack_274 = local_280;
                        uStack_270 = local_280;
                        uStack_26c = local_280;
                        uStack_268 = local_280;
                        uStack_264 = local_280;
                        uStack_1fc = local_200;
                        uStack_1f8 = local_200;
                        uStack_1f4 = local_200;
                        uStack_1f0 = local_200;
                        uStack_1ec = local_200;
                        uStack_1e8 = local_200;
                        uStack_1e4 = local_200;
                        local_1e0 = local_440._0_8_;
                        uStack_1d8 = local_440._8_8_;
                        uStack_1d0 = local_440._16_8_;
                        uStack_1c8 = local_440._24_8_;
                        local_1c0 = local_460;
                        vpcmpeqd_avx2(local_460,local_460);
                        local_1a0 = (local_690.context)->instID[0];
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = (local_690.context)->instPrimID[0];
                        uStack_17c = local_180;
                        uStack_178 = local_180;
                        uStack_174 = local_180;
                        uStack_170 = local_180;
                        uStack_16c = local_180;
                        uStack_168 = local_180;
                        uStack_164 = local_180;
                        local_5c0 = local_2a0;
                        local_690.valid = (int *)local_5c0;
                        local_690.geometryUserPtr = *(void **)(local_4c0._0_8_ + 0x18);
                        local_690.hit = (RTCHitN *)&local_280;
                        local_690.N = 8;
                        local_690.ray = (RTCRayN *)ray;
                        if (*(code **)(local_4c0._0_8_ + 0x48) != (code *)0x0) {
                          (**(code **)(local_4c0._0_8_ + 0x48))(&local_690);
                          auVar186 = ZEXT3264(local_2c0);
                          auVar190 = ZEXT3264(local_660);
                          auVar185 = ZEXT3264(local_560);
                          auVar194 = ZEXT3264(local_540);
                          auVar193 = ZEXT3264(local_500);
                          auVar192 = ZEXT3264(local_4e0);
                          auVar87 = vxorps_avx512vl(auVar195,auVar195);
                          auVar196 = ZEXT1664(auVar87);
                          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar198 = ZEXT3264(auVar96);
                        }
                        auVar87 = auVar196._0_16_;
                        if (local_5c0 == (undefined1  [32])0x0) {
                          auVar197 = ZEXT3264(local_640);
                          auVar200 = ZEXT3264(local_600);
                          auVar199 = ZEXT3264(local_620);
                        }
                        else {
                          p_Var16 = context->args->filter;
                          if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)(local_4c0._0_8_ + 0x3e) & 0x40) != 0)))) {
                            (*p_Var16)(&local_690);
                            auVar186 = ZEXT3264(local_2c0);
                            auVar190 = ZEXT3264(local_660);
                            auVar185 = ZEXT3264(local_560);
                            auVar194 = ZEXT3264(local_540);
                            auVar193 = ZEXT3264(local_500);
                            auVar192 = ZEXT3264(local_4e0);
                            auVar87 = vxorps_avx512vl(auVar87,auVar87);
                            auVar196 = ZEXT1664(auVar87);
                            auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar198 = ZEXT3264(auVar96);
                          }
                          uVar76 = vptestmd_avx512vl(local_5c0,local_5c0);
                          auVar96 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar17 = (bool)((byte)uVar76 & 1);
                          bVar18 = (bool)((byte)(uVar76 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar76 >> 2) & 1);
                          bVar20 = (bool)((byte)(uVar76 >> 3) & 1);
                          bVar21 = (bool)((byte)(uVar76 >> 4) & 1);
                          bVar22 = (bool)((byte)(uVar76 >> 5) & 1);
                          bVar23 = (bool)((byte)(uVar76 >> 6) & 1);
                          bVar24 = SUB81(uVar76 >> 7,0);
                          *(uint *)(local_690.ray + 0x100) =
                               (uint)bVar17 * auVar96._0_4_ |
                               (uint)!bVar17 * *(int *)(local_690.ray + 0x100);
                          *(uint *)(local_690.ray + 0x104) =
                               (uint)bVar18 * auVar96._4_4_ |
                               (uint)!bVar18 * *(int *)(local_690.ray + 0x104);
                          *(uint *)(local_690.ray + 0x108) =
                               (uint)bVar19 * auVar96._8_4_ |
                               (uint)!bVar19 * *(int *)(local_690.ray + 0x108);
                          *(uint *)(local_690.ray + 0x10c) =
                               (uint)bVar20 * auVar96._12_4_ |
                               (uint)!bVar20 * *(int *)(local_690.ray + 0x10c);
                          *(uint *)(local_690.ray + 0x110) =
                               (uint)bVar21 * auVar96._16_4_ |
                               (uint)!bVar21 * *(int *)(local_690.ray + 0x110);
                          *(uint *)(local_690.ray + 0x114) =
                               (uint)bVar22 * auVar96._20_4_ |
                               (uint)!bVar22 * *(int *)(local_690.ray + 0x114);
                          *(uint *)(local_690.ray + 0x118) =
                               (uint)bVar23 * auVar96._24_4_ |
                               (uint)!bVar23 * *(int *)(local_690.ray + 0x118);
                          *(uint *)(local_690.ray + 0x11c) =
                               (uint)bVar24 * auVar96._28_4_ |
                               (uint)!bVar24 * *(int *)(local_690.ray + 0x11c);
                          auVar197 = ZEXT3264(local_640);
                          auVar200 = ZEXT3264(local_600);
                          auVar199 = ZEXT3264(local_620);
                          if (local_5c0 != (undefined1  [32])0x0) {
                            bVar75 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x100) = auVar186._0_4_;
                        uVar77 = local_520._0_8_ ^ 1L << (local_4a0._0_8_ & 0x3f);
                        bVar75 = 0;
                        local_520._0_8_ = uVar77;
                        lVar30 = 0;
                        for (uVar76 = uVar77; (uVar76 & 1) == 0;
                            uVar76 = uVar76 >> 1 | 0x8000000000000000) {
                          lVar30 = lVar30 + 1;
                        }
                        local_4a0._0_8_ = lVar30;
                      } while (uVar77 != 0);
                    }
                    bVar78 = (bool)(bVar78 | bVar75);
                  }
                }
                goto LAB_01d2b412;
              }
            }
            auVar190 = ZEXT3264(local_660);
          }
LAB_01d2b412:
          lVar79 = lVar79 + 8;
          auVar191 = auVar185;
        } while ((int)lVar79 < iVar14);
      }
      if (bVar78) {
        return bVar78;
      }
      uVar139 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar34._4_4_ = uVar139;
      auVar34._0_4_ = uVar139;
      auVar34._8_4_ = uVar139;
      auVar34._12_4_ = uVar139;
      auVar34._16_4_ = uVar139;
      auVar34._20_4_ = uVar139;
      auVar34._24_4_ = uVar139;
      auVar34._28_4_ = uVar139;
      uVar26 = vcmpps_avx512vl(local_80,auVar34,2);
      uVar80 = (uint)uVar81 & (uint)uVar26;
      uVar81 = (ulong)uVar80;
    } while (uVar80 != 0);
  }
  return bVar78;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }